

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Decode.cpp
# Opt level: O3

error<idx2::idx2_err_code> idx2::Decode(idx2_file *Idx2,params *P,buffer *OutBuf)

{
  ulong *puVar1;
  brick_pool *Bp;
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  int iVar4;
  out_mode oVar5;
  cstr pcVar6;
  u64 uVar7;
  allocator *paVar8;
  bool bVar9;
  bool bVar10;
  undefined8 uVar11;
  bucket_status *pbVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  bitstream *pbVar18;
  dtype dVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  byte bVar25;
  byte bVar26;
  int iVar27;
  cstr pcVar28;
  long lVar29;
  ulong uVar30;
  u64 uVar31;
  i64 iVar32;
  code *pcVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  uint uVar37;
  long lVar38;
  brick_volume *Key;
  short *Key_00;
  ulong *puVar39;
  grid *Grid2;
  byte **Key_01;
  char *pcVar40;
  dtype dVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  ulong uVar46;
  long lVar47;
  ushort uVar48;
  int iVar49;
  params *ppVar50;
  char cVar51;
  uint uVar52;
  int iVar53;
  ulong *puVar54;
  allocator *paVar55;
  byte *pbVar56;
  ulong uVar57;
  long lVar58;
  brick_volume *Val;
  int iVar59;
  uint uVar60;
  uint uVar61;
  undefined8 uVar62;
  int iVar63;
  ulong *puVar64;
  ulong uVar65;
  idx2_file *Idx2_00;
  long *in_FS_OFFSET;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  error<idx2::mmap_err_code> eVar69;
  extent eVar70;
  error<idx2::idx2_err_code> eVar71;
  v3i Brick3;
  v3i Brick3_00;
  i16 BpKey;
  u64 BrickKey;
  extent PGrid;
  u64 PKey;
  grid SbGridNonExt;
  extent ExtentInChunks;
  extent ExtentInBricks;
  extent Skip_1;
  stream_cache Streams;
  grid OutGrid;
  extent VolExtentInChunks;
  extent VolExtentInBricks;
  timer DecodeTimer;
  brick_traverse First_2;
  mmap_volume OutVol;
  iterator BrickIt_1;
  extent Skip;
  iterator BrickIt;
  decode_data D;
  chunk_traverse First_1;
  file_traverse First;
  file_traverse FileStack [64];
  char local_37d6;
  i8 local_37d5;
  uint local_37d4;
  idx2_file *local_37d0;
  ulong local_37c8;
  undefined4 local_37c0;
  undefined1 local_37bc [12];
  ulong local_37b0;
  brick_volume *local_37a8;
  params *local_37a0;
  u64 local_3798;
  int local_3790;
  uint local_378c;
  uint local_3788;
  int local_3784;
  long local_3780;
  ulong local_3778;
  undefined8 local_3770;
  ulong local_3768;
  int local_375c;
  uint local_3758;
  int local_3754;
  undefined4 local_3750;
  int local_374c;
  ulong local_3748;
  ulong *local_3740;
  long local_3738;
  ulong local_3730;
  ulong local_3728;
  short *local_3720;
  int local_3718;
  int local_3714;
  int local_3710;
  int local_370c;
  long local_3708;
  ulong local_3700;
  byte *local_36f8;
  ulong local_36f0;
  ulong local_36e8;
  ulong local_36e0;
  ulong local_36d8;
  ulong local_36d0;
  ulong local_36c8;
  ulong local_36c0;
  i64 *local_36b8;
  ulong local_36b0;
  long local_36a8;
  undefined1 local_36a0 [8];
  iterator local_3698;
  uint local_3674;
  int local_3670;
  int local_366c;
  int local_3668;
  uint local_3664;
  int local_3660;
  uint local_365c;
  uint local_3658;
  uint local_3654;
  uint local_3650;
  uint local_364c;
  undefined1 local_3648 [24];
  bool local_3630;
  expected<const_idx2::chunk_exp_cache_*,_idx2::idx2_err_code> local_3628;
  ulong local_3608;
  long local_3600;
  ulong local_35f8;
  long local_35f0;
  stack_array<idx2::v3<int>,_16> *local_35e8;
  stack_array<idx2::v3<int>,_16> *local_35e0;
  stack_array<idx2::v3<int>,_16> *local_35d8;
  ulong local_35d0;
  ulong local_35c8;
  ulong local_35c0;
  undefined4 *local_35b8;
  undefined8 *local_35b0;
  v3i *local_35a8;
  brick_volume *local_35a0;
  ulong local_3598;
  ulong local_3590;
  ulong local_3588;
  double local_3580;
  extent local_3578;
  extent local_3568;
  byte *local_3558;
  i64 iStack_3550;
  allocator *local_3548;
  ulong local_3540;
  dtype local_3538;
  undefined8 local_3528;
  long local_3520;
  stack_array<idx2::array<idx2::v3<int>_>,_16> *local_3518;
  stack_array<idx2::v3<int>,_16> *local_3510;
  v3<int> *local_3508;
  v3<int> *local_3500;
  hash_table<unsigned_long,_idx2::brick_volume> *local_34f8;
  transform_info *local_34f0;
  array<idx2::subband> *local_34e8;
  v3<int> *local_34e0;
  long local_34d8;
  array<idx2::v3<int>_> *local_34d0;
  long local_34c8;
  ulong local_34c0;
  ulong local_34b8;
  long local_34b0;
  ulong local_34a8;
  ulong local_34a0;
  brick_volume local_3498;
  hash_table<short,_idx2::bitstream> local_3458;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Decode_cpp:334:3)>
  local_3428;
  grid local_3410;
  extent local_33f8;
  extent local_33e8;
  timespec local_33d8;
  hash_table<unsigned_long,_idx2::brick_volume> local_33c8;
  int iStack_3398;
  undefined4 uStack_3394;
  ulong uStack_3390;
  undefined4 local_31c8;
  undefined4 uStack_31c4;
  undefined4 uStack_31c0;
  undefined4 uStack_31bc;
  undefined8 local_31b8;
  undefined8 uStack_31b0;
  undefined8 uStack_31a8;
  undefined8 uStack_31a0;
  undefined8 local_3198;
  undefined8 uStack_3190;
  undefined8 uStack_3188;
  undefined8 uStack_3180;
  undefined1 local_3178 [72];
  allocator *local_3130;
  iterator local_3128;
  iterator local_3108;
  int iStack_30e8;
  int iStack_30e4;
  _func_int ***ppp_Stack_30e0;
  int iStack_30d8;
  undefined4 uStack_30d4;
  long lStack_30d0;
  undefined8 local_2f08;
  undefined8 uStack_2f00;
  undefined8 uStack_2ef8;
  undefined8 uStack_2ef0;
  iterator local_2ee8;
  undefined1 local_2ec8 [56];
  brick_pool bStack_2e90;
  thread_pool local_2e28;
  __native_type local_2d28;
  __native_type _Stack_2d00;
  __native_type _Stack_2cd8;
  condition_variable local_2cb0 [48];
  i64 local_2c80;
  __atomic_base<unsigned_long> _Stack_2c78;
  __atomic_base<unsigned_long> _Stack_2c70;
  __atomic_base<unsigned_long> _Stack_2c68;
  __atomic_base<unsigned_long> local_2c60;
  atomic<unsigned_long> aStack_2c58;
  __atomic_base<long> _Stack_2c50;
  __atomic_base<long> _Stack_2c48;
  undefined4 auStack_2c40 [2];
  ulong local_2c38 [2];
  undefined8 uStack_2c28;
  uint uStack_2c20;
  undefined1 auStack_2c1c [8];
  uint uStack_2c14;
  long lStack_2c10;
  int aiStack_2c08 [2];
  long alStack_2c00 [503];
  undefined8 uStack_1c48;
  undefined4 auStack_1c40 [2];
  undefined1 local_1c38 [16];
  undefined1 auStack_1c28 [20];
  int iStack_1c14;
  long alStack_1c10 [2];
  long lStack_1c00;
  char local_1bf8 [8];
  char acStack_1bf0 [8];
  char acStack_1be8 [8];
  char acStack_1be0 [8];
  char local_1bd8 [8];
  char acStack_1bd0 [8];
  char acStack_1bc8 [8];
  char acStack_1bc0 [8];
  anon_union_12_8_3dedac88_for_v3<int>_1 local_1bb8;
  dtype local_1bac;
  unsigned_long local_c38 [2];
  int aiStack_c28 [2];
  undefined1 auStack_c20 [8];
  int aiStack_c18 [2];
  long alStack_c10 [380];
  
  clock_gettime(1,&local_33d8);
  local_37a0 = P;
  GetGrid(&local_3410,Idx2,&P->DecodeExtent);
  if (Mallocator()::Instance == '\0') {
    Decode();
  }
  local_3178._0_8_ = (byte *)0x0;
  local_3178._8_8_ = 0;
  local_3178._16_8_ = &Mallocator()::Instance;
  local_3178._24_8_ = 0;
  local_3178[0x20] = __Invalid__;
  if (Mallocator()::Instance == '\0') {
    Decode();
  }
  local_3178._56_16_ = SUB6416(ZEXT864(0),0) << 0x40;
  local_3130 = (allocator *)&Mallocator()::Instance;
  if (Mallocator()::Instance == '\0') {
    Decode();
  }
  local_3558 = (byte *)0x0;
  iStack_3550 = 0;
  local_3548 = (allocator *)&Mallocator()::Instance;
  local_3540 = 0;
  local_3538 = __Invalid__;
  local_3428.Func.P = local_37a0;
  local_3428.Func.OutVol = (mmap_volume *)local_3178;
  local_3428.Dismissed = false;
  local_37d0 = Idx2;
  if (local_37a0->OutMode == RegularGridMem) {
    local_3548 = OutBuf->Alloc;
    local_3558 = OutBuf->Data;
    iStack_3550 = OutBuf->Bytes;
    local_3540 = local_3410.super_extent.Dims & 0x7fffffffffffffff;
    local_3538 = Idx2->DType;
  }
  else if (local_37a0->OutMode == RegularGridFile) {
    local_1c38._0_8_ = *(undefined8 *)Idx2->Name;
    local_1c38._8_8_ = *(undefined8 *)(Idx2->Name + 8);
    alStack_1c10[1] = *(long *)(Idx2->Name + 0x30);
    lStack_1c00 = *(long *)(Idx2->Name + 0x38);
    stack0xffffffffffffe3e8 = *(undefined8 *)(Idx2->Name + 0x20);
    alStack_1c10[0] = *(undefined8 *)(Idx2->Name + 0x28);
    auStack_1c28._0_16_ = *(undefined1 (*) [16])(Idx2->Name + 0x10);
    local_1bf8 = *(char (*) [8])Idx2->Field;
    acStack_1bf0 = *(char (*) [8])(Idx2->Field + 8);
    acStack_1be8 = *(char (*) [8])(Idx2->Field + 0x10);
    acStack_1be0 = *(char (*) [8])(Idx2->Field + 0x18);
    local_1bd8 = *(char (*) [8])(Idx2->Field + 0x20);
    acStack_1bd0 = *(char (*) [8])(Idx2->Field + 0x28);
    acStack_1bc8 = *(char (*) [8])(Idx2->Field + 0x30);
    acStack_1bc0 = *(char (*) [8])(Idx2->Field + 0x38);
    local_1bb8.field_3.XY.field_0 =
         (v2<int>)((long)(local_3410.super_extent.Dims << 0x16) >> 0xb & 0xffffffff00000000U |
                  (ulong)(uint)((long)(local_3410.super_extent.Dims << 0x2b) >> 0x2b));
    local_1bb8.field_0.Z = (int)((long)(local_3410.super_extent.Dims * 2) >> 0x2b);
    local_1bac = Idx2->DType;
    if (local_37a0->OutFile == (cstr)0x0) {
      pcVar6 = local_37a0->OutDir;
      pcVar28 = ToRawFileName((metadata *)local_1c38);
      pcVar40 = (char *)(*in_FS_OFFSET + -0xc80);
      snprintf(pcVar40,0x400,"%s/%s-tolerance-%f.raw",pcVar6,pcVar28);
    }
    else {
      pcVar40 = (char *)(*in_FS_OFFSET + -0xc80);
      snprintf(pcVar40,0x400,"%s/%s",local_37a0->OutDir,local_37a0->OutFile);
    }
    eVar69 = MapVolume(pcVar40,(v3i *)&local_1bb8.field_0,local_1bac,(mmap_volume *)local_3178,Write
                      );
    printf("writing output volume to %s\n",pcVar40,eVar69._8_8_);
  }
  Idx2_00 = local_37d0;
  bStack_2e90.BrickTable.Vals = (brick_volume *)0x0;
  bStack_2e90.BrickTable.Stats = (bucket_status *)0x0;
  bStack_2e90.BrickTable.Size = 0;
  bStack_2e90.BrickTable.LogCapacity = 0;
  local_2ec8._32_8_ = 0;
  local_2ec8._40_8_ = 0;
  local_2ec8._48_8_ = (allocator *)0x0;
  bStack_2e90.BrickTable.Keys = (unsigned_long *)0x0;
  local_2ec8._0_8_ = (decode_data *)0x0;
  local_2ec8._8_8_ = (unsigned_long *)0x0;
  local_2ec8._16_8_ = (file_cache *)0x0;
  local_2ec8._24_8_ = (bucket_status *)0x0;
  bStack_2e90.BrickTable.Alloc = (allocator *)0x0;
  if (Mallocator()::Instance == '\0') {
    Decode();
  }
  if (Mallocator()::Instance == '\0') {
    Decode();
  }
  bStack_2e90.ResolutionLevels.Buffer.Data = (byte *)0x0;
  bStack_2e90.ResolutionLevels.Buffer.Bytes = 0;
  bStack_2e90.ResolutionLevels.Buffer.Alloc = (allocator *)&Mallocator()::Instance;
  bStack_2e90.ResolutionLevels.Size = 0;
  bStack_2e90.ResolutionLevels.Capacity = 0;
  bStack_2e90.ResolutionLevels.Alloc = (allocator *)&Mallocator()::Instance;
  bStack_2e90.Idx2 = (idx2_file *)0x0;
  BS::thread_pool::thread_pool((thread_pool *)(local_2ec8 + 0xa0),0);
  _Stack_2cd8._16_8_ = 0;
  _Stack_2cd8.__data.__list.__prev = (__pthread_internal_list *)0x0;
  _Stack_2cd8.__data.__list.__next = (__pthread_internal_list *)0x0;
  _Stack_2d00.__data.__list.__prev = (__pthread_internal_list *)0x0;
  _Stack_2d00.__data.__list.__next = (__pthread_internal_list *)0x0;
  _Stack_2cd8.__align = 0;
  _Stack_2cd8._8_8_ = 0;
  local_2d28.__data.__list.__next = (__pthread_internal_list *)0x0;
  _Stack_2d00.__align = 0;
  _Stack_2d00._8_8_ = 0;
  _Stack_2d00._16_8_ = 0;
  local_2d28.__align = 0;
  local_2d28._8_8_ = 0;
  local_2d28._16_8_ = 0;
  local_2d28.__data.__list.__prev = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable((condition_variable *)(local_2ec8 + 0x218));
  local_2c60._M_i = 0;
  aStack_2c58.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  _Stack_2c50._M_i = 0;
  _Stack_2c48._M_i = 0;
  local_2c80 = 0;
  _Stack_2c78._M_i = 0;
  _Stack_2c70._M_i = 0;
  _Stack_2c68._M_i = 0;
  if (Mallocator()::Instance == '\0') {
    Decode();
  }
  Init((decode_data *)local_2ec8,Idx2_00,(allocator *)&Mallocator()::Instance);
  ppVar50 = local_37a0;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = local_37a0->DecodeTolerance;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = Idx2_00->Tolerance;
  auVar3 = vmaxsd_avx(auVar66,auVar3);
  local_3580 = auVar3._0_8_;
  if (Mallocator()::Instance == '\0') {
    Decode();
  }
  local_37d6 = Idx2_00->NLevels;
  local_35b0 = (undefined8 *)(*in_FS_OFFSET + -0xe80);
  local_35b8 = (undefined4 *)(*in_FS_OFFSET + -0xf80);
  cVar51 = local_37d6 + -1;
  if (cVar51 < '\0') {
LAB_0017ac2c:
    Bp = (brick_pool *)(local_2ec8 + 0x38);
    if (ppVar50->OutMode == HashMap) {
      PrintStatistics(Bp);
      ComputeBrickResolution(Bp);
      WriteBricks(Bp,"bricks");
    }
    clock_gettime(1,(timespec *)local_1c38);
    printf("total decode time   = %f\n",
           (double)(long)((double)(local_1c38._0_8_ - local_33d8.tv_sec) * 1000000000.0 +
                         (double)(local_1c38._8_8_ - local_33d8.tv_nsec)) / 1000000000.0,
           (double)(local_1c38._8_8_ - local_33d8.tv_nsec),0x41cdcd6500000000,0);
    printf("io time             = %f\n",(double)(long)_Stack_2c78._M_i / 1000000000.0);
    printf("data movement time  = %f\n",
           (double)(long)aStack_2c58.super___atomic_base<unsigned_long>._M_i / 1000000000.0);
    uVar65 = 0;
    printf("exp   bytes read    = %li\n",_Stack_2c70._M_i);
    printf("data  bytes read    = %li\n",_Stack_2c68._M_i);
    printf("total bytes read    = %li\n",_Stack_2c68._M_i + _Stack_2c70._M_i);
    printf("total bytes decoded = %li\n",local_2c60._M_i >> 3);
    printf("final size of brick hashmap = %li\n",bStack_2e90.BrickTable.Size);
    printf("number of significant blocks = %li\n",_Stack_2c50._M_i);
    printf("number of insignificant subbands = %li\n",_Stack_2c48._M_i);
    *(char **)(*in_FS_OFFSET + -0x780) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Decode.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x880) = 0x1eb;
    uVar62 = "";
    uVar57 = 0;
    uVar30 = 0;
LAB_0017ae55:
    uVar65 = uVar57 | uVar30 | uVar65;
    scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Decode.cpp:362:3)>
    ::~scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Decode_cpp:362:3)>
                    *)local_2ec8);
    std::condition_variable::~condition_variable((condition_variable *)(local_2ec8 + 0x218));
    BS::thread_pool::~thread_pool((thread_pool *)(local_2ec8 + 0xa0));
    scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Decode.cpp:334:3)>
    ::~scope_guard(&local_3428);
    eVar71.Code = (char)uVar65;
    eVar71.StackIdx = (char)(uVar65 >> 8);
    eVar71.StrGened = (bool)(char)(uVar65 >> 0x10);
    eVar71._11_5_ = (int5)(uVar65 >> 0x18);
    eVar71.Msg = (cstr)uVar62;
    return eVar71;
  }
  local_35a8 = &Idx2_00->BrickDimsExt3;
  local_35d8 = &Idx2_00->BricksPerChunk3s;
  local_35e0 = &Idx2_00->ChunksPerFile3s;
  local_35e8 = &Idx2_00->NFiles3;
  local_34e8 = &Idx2_00->Subbands;
  local_3510 = &Idx2_00->NBricks3;
  local_3518 = &Idx2_00->DecodeSubbandSpacings;
  local_34f0 = &Idx2_00->TransformDetails;
  iVar34 = (int)cVar51;
  local_31c8 = 1;
  uStack_31c4 = 1;
  uStack_31c0 = 1;
  uStack_31bc = 1;
  local_2f08 = 0x8000000000000000;
  uStack_2f00 = 0x8000000000000000;
  uStack_2ef8 = 0x8000000000000000;
  uStack_2ef0 = 0x8000000000000000;
  local_3198 = 0xaaaaaaaaaaaaaaaa;
  uStack_3190 = 0xaaaaaaaaaaaaaaaa;
  uStack_3188 = 0xaaaaaaaaaaaaaaaa;
  uStack_3180 = 0xaaaaaaaaaaaaaaaa;
  local_31b8 = 0x5555555555555556;
  uStack_31b0 = 0x5555555555555556;
  uStack_31a8 = 0x5555555555555556;
  uStack_31a0 = 0x5555555555555556;
  local_35f0 = 0;
  local_36c8 = 0;
  local_3528 = 0x100000001;
  uVar30 = 0;
  lVar38 = 0;
  local_37bc[3] = cVar51;
  do {
    iVar27 = 1;
    if (1 < iVar34) {
      iVar27 = iVar34;
    }
    if ('\x0f' < local_37bc[3]) {
      pcVar40 = 
      "t &idx2::stack_array<unsigned char, 16>::operator[](int) const [t = unsigned char, N = 16]";
LAB_0017aebe:
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,pcVar40);
    }
    bVar26 = (byte)iVar34;
    local_3788 = (uint)(char)bVar26;
    local_3780 = (long)(int)local_3788;
    if ((Idx2_00->DecodeSubbandMasks).Arr[local_3780] == '\0') goto LAB_0017ac2c;
    if (bVar26 == 0) {
      local_3714 = 1;
      uVar62 = local_3528;
    }
    else {
      uVar62 = 0x100000001;
      local_3714 = 1;
      do {
        local_3714 = local_3714 * (Idx2_00->GroupBrick3).field_0.field_0.Z;
        uVar62 = CONCAT44((int)((ulong)uVar62 >> 0x20) * (Idx2_00->GroupBrick3).field_0.field_0.Y,
                          (Idx2_00->GroupBrick3).field_0.field_0.X * (int)uVar62);
        iVar27 = iVar27 + -1;
      } while (iVar27 != 0);
    }
    uVar31 = (ppVar50->DecodeExtent).From;
    uVar7 = (ppVar50->DecodeExtent).Dims;
    local_3718 = (Idx2_00->BrickDims3).field_0.field_0.X * (int)uVar62;
    uVar61 = (int)((ulong)uVar62 >> 0x20) * (Idx2_00->BrickDims3).field_0.field_0.Y;
    local_35c0 = (ulong)uVar61;
    local_3714 = local_3714 * (Idx2_00->BrickDims3).field_0.field_0.Z;
    local_3738 = local_3780 * 0xc;
    local_36d8 = (long)(uVar31 * 2) >> 0x2b;
    uVar57 = (long)(uVar31 << 0x16) >> 0xb;
    iVar35 = (int)uVar31 << 0xb;
    iVar36 = iVar35 >> 0xb;
    uVar52 = (uint)local_36c8 | (((int)uVar7 << 0xb) >> 0xb) + iVar36 + -1;
    local_3784 = local_35e0->Arr[local_3780].field_0.field_0.X;
    local_374c = local_35e0->Arr[local_3780].field_0.field_0.Y;
    local_3770 = uVar57 >> 0x20;
    uVar42 = (uint)((long)(uVar31 << 0x16) >> 0x3f);
    iVar27 = (int)(uVar31 * 2 >> 0x20);
    uVar43 = iVar27 >> 0x1f;
    local_36c8 = ((uVar57 & 0xffffffff00000000) + ((long)(uVar7 << 0x16) >> 0xb) &
                 0xffffffff00000000) - 0x100000000;
    local_37c8 = local_36c8 >> 0x20;
    uVar44 = (uint)((long)local_36c8 >> 0x3f);
    uVar37 = (int)uVar52 / local_3718 - iVar36 / local_3718;
    local_3728 = (ulong)uVar37;
    uVar45 = (uint)((long)((ulong)uVar42 << 0x20 | local_3770) / (long)(int)uVar61);
    local_37bc._4_4_ = ((iVar27 >> 0xb) + (int)((long)(uVar7 * 2) >> 0x2b)) - 1;
    uVar60 = (uint)((long)((ulong)uVar43 << 0x20 | local_36d8 & 0xffffffff) / (long)local_3714);
    local_36b0 = (ulong)(uVar60 & 0x1fffff) << 0x2a |
                 (ulong)(uVar45 & 0x1fffff) << 0x15 | (ulong)(iVar36 / local_3718 & 0x1fffff);
    iVar63 = local_35d8->Arr[local_3780].field_0.field_0.X * local_3718;
    local_37d4 = local_35d8->Arr[local_3780].field_0.field_0.Y * uVar61;
    iVar53 = local_35d8->Arr[local_3780].field_0.field_0.Z * local_3714;
    iVar59 = local_35e0->Arr[local_3780].field_0.field_0.Z * iVar53;
    iVar35 = iVar35 >> 0x1f;
    uVar57 = CONCAT44(iVar35,iVar36) / (long)iVar63;
    local_3720 = (short *)(uVar57 & 0xffffffff);
    local_3798 = CONCAT44(local_3798._4_4_,iVar63);
    local_37b0 = CONCAT44(local_37b0._4_4_,iVar53);
    uVar65 = CONCAT44(iVar35,iVar36) / (long)(local_3784 * iVar63);
    local_3768 = uVar65 & 0xffffffff;
    uVar46 = local_3768;
    lVar47 = (long)((ulong)uVar43 << 0x20 | local_36d8 & 0xffffffff) / (long)iVar59;
    iVar27 = (int)((long)((ulong)uVar44 << 0x20 | local_37c8) / (long)(int)(local_374c * local_37d4)
                  );
    local_37a8 = (brick_volume *)CONCAT44(local_37a8._4_4_,iVar27);
    local_3568.Dims =
         (ulong)(((int)local_37bc._4_4_ / local_3714 - uVar60) + 1 & 0x1fffff) << 0x2a |
         (ulong)(((int)((long)((ulong)uVar44 << 0x20 | local_37c8) / (long)(int)uVar61) - uVar45) +
                 1 & 0x1fffff) << 0x15 | (ulong)(uVar37 + 1 & 0x1fffff);
    local_3768._0_4_ = (uint)uVar65;
    uVar37 = (uint)uVar57;
    uVar60 = (uint)((long)((ulong)uVar42 << 0x20 | local_3770) / (long)(int)local_37d4);
    uVar43 = (uint)((long)((ulong)uVar43 << 0x20 | local_36d8 & 0xffffffff) / (long)iVar53);
    local_3578.From =
         (ulong)(uVar43 & 0x1fffff) << 0x2a |
         (ulong)(uVar60 & 0x1fffff) << 0x15 | (ulong)(uVar37 & 0x1fffff);
    uVar42 = (uint)((long)((ulong)uVar42 << 0x20 | local_3770) /
                   (long)(int)(local_374c * local_37d4));
    local_3578.Dims =
         (ulong)(((int)local_37bc._4_4_ / iVar53 - uVar43) + 1 & 0x1fffff) << 0x2a |
         (ulong)(((int)((long)((ulong)uVar44 << 0x20 | local_37c8) / (long)(int)local_37d4) - uVar60
                 ) + 1 & 0x1fffff) << 0x15 | (ulong)(((int)uVar52 / iVar63 - uVar37) + 1 & 0x1fffff)
    ;
    local_36a8._0_4_ = (uint)lVar38;
    local_3520 = (long)((ulong)(uint)(local_37d0->Dims3).field_0.field_0.Y << 0x2b) >> 0xb;
    uVar37 = (uint)local_35f0 |
             (((local_37d0->Dims3).field_0.field_0.X << 0xb) >> 0xb | (uint)local_36a8) - 1;
    local_35f0 = local_3520 + -0x100000000;
    iVar36 = (int)((ulong)local_35f0 >> 0x20);
    iVar35 = (((local_37d0->Dims3).field_0.field_0.Z << 0xb) >> 0xb) + -1;
    local_33e8.Dims =
         (ulong)(iVar35 / local_3714 + 1U & 0x1fffff) << 0x2a |
         (ulong)(iVar36 / (int)uVar61 + 1U & 0x1fffff) << 0x15 |
         (ulong)((int)uVar37 / local_3718 + 1U & 0x1fffff);
    local_33e8.From = 0;
    local_33f8.Dims =
         (ulong)(iVar35 / iVar53 + 1U & 0x1fffff) << 0x2a |
         (ulong)(iVar36 / (int)local_37d4 + 1U & 0x1fffff) << 0x15 |
         (ulong)((int)uVar37 / iVar63 + 1U & 0x1fffff);
    local_3500 = local_35d8->Arr + local_3780;
    local_3508 = local_35e0->Arr + local_3780;
    local_33f8.From = 0;
    lVar29 = 0x28;
    do {
      *(undefined8 *)((long)local_c38 + lVar29) = 0;
      lVar29 = lVar29 + 0x30;
    } while (lVar29 != 0xc28);
    lVar29 = (long)local_35e8->Arr[local_3780].field_0.field_0.X;
    if (lVar29 == 0) {
      uVar37 = 1;
    }
    else {
      uVar57 = lVar29 - 1;
      lVar29 = 0x3f;
      if (uVar57 != 0) {
        for (; uVar57 >> lVar29 == 0; lVar29 = lVar29 + -1) {
        }
      }
      uVar37 = (uint)(1L << (-((byte)lVar29 ^ 0x3f) & 0x3f));
      if (uVar57 == 0) {
        uVar37 = 1;
      }
    }
    lVar29 = (long)local_35e8->Arr[local_3780].field_0.field_0.Y;
    local_36d0 = 0x100000000;
    if (lVar29 != 0) {
      uVar57 = lVar29 - 1;
      lVar29 = 0x3f;
      if (uVar57 != 0) {
        for (; uVar57 >> lVar29 == 0; lVar29 = lVar29 + -1) {
        }
      }
      local_36d0 = 0x100000000 << (-((byte)lVar29 ^ 0x3f) & 0x3f);
      if (uVar57 == 0) {
        local_36d0 = 0x100000000;
      }
    }
    lVar29 = (long)local_35e8->Arr[local_3780].field_0.field_0.Z;
    if (lVar29 == 0) {
      aiStack_c18[1] = 1;
    }
    else {
      uVar57 = lVar29 - 1;
      lVar29 = 0x3f;
      if (uVar57 != 0) {
        for (; uVar57 >> lVar29 == 0; lVar29 = lVar29 + -1) {
        }
      }
      aiStack_c18[1] = (int)(1L << (-((byte)lVar29 ^ 0x3f) & 0x3f));
      if (uVar57 == 0) {
        aiStack_c18[1] = 1;
      }
    }
    lVar58 = lVar47 << 0x2b;
    local_c38[0] = (local_37d0->FilesOrder).Arr[local_3780];
    local_c38[1] = local_c38[0];
    uVar57 = 0;
    aiStack_c28[0] = 0;
    aiStack_c28[1] = 0;
    auStack_c20._0_4_ = 0;
    stack0xfffffffffffff3e4 = (uVar37 | (uint)uVar30) | local_36d0;
    alStack_c10[0] = 0;
    lVar29 = (ulong)((uint)local_3768 & 0x1fffff) << 0x2b;
    local_3600 = lVar29 >> 0x2b;
    local_3708 = lVar58 >> 0x2b;
    local_3608 = (long)((ulong)(uVar42 & 0x1fffff) << 0x2b) >> 0xb;
    local_35d0 = (ulong)(uint)(((int)((((int)uVar52 / (local_3784 * iVar63) - (uint)local_3768) + 1)
                                     * 0x800) >> 0xb) + (int)(lVar29 >> 0x2b));
    local_3748 = (ulong)(uint)((int)((long)((ulong)(((int)local_37bc._4_4_ / iVar59 - (int)lVar47) +
                                                   1) << 0x2b) >> 0x2b) + (int)(lVar58 >> 0x2b));
    local_35f8 = ((long)((ulong)((iVar27 - uVar42) + 1 & 0x1fffff) << 0x2b) >> 0xb) + local_3608 >>
                 0x20;
    local_3608 = local_3608 >> 0x20;
    local_3674 = (uint)local_37d6;
    local_34d8 = (long)local_37d6;
    local_34e0 = local_3510->Arr + local_3780;
    local_3790 = local_3788 + 1;
    local_34d0 = local_3518->Arr + local_3780;
    local_34f8 = (hash_table<unsigned_long,_idx2::brick_volume> *)
                 ((ulong)(1 << (bVar26 & 0x1f) & 0x1fffff) * 0x40000200001);
    ppVar50 = local_37a0;
    Idx2_00 = local_37d0;
    local_3778 = uVar30;
    local_3768 = uVar46;
    local_375c = iVar34;
    local_36a8 = lVar38;
    local_3568.From = local_36b0;
    do {
      uVar65 = uVar57 & 0xffffffff;
      lVar38 = uVar65 * 0x30;
      puVar64 = local_c38 + uVar65 * 6;
      uVar30 = *puVar64;
      uVar46 = uVar30 >> 2;
      *puVar64 = uVar46;
      uVar37 = (uint)uVar30 & 3;
      if (uVar37 == 3) {
        if (uVar46 == 3) {
          *puVar64 = local_c38[uVar65 * 6 + 1];
        }
        else {
          local_c38[uVar65 * 6 + 1] = uVar46;
        }
      }
      else {
        local_3700 = (ulong)((int)uVar57 - 1);
        iVar34 = aiStack_c28[uVar65 * 0xc];
        if (((*(int *)(auStack_c20 + lVar38 + 4) - iVar34 == 1) &&
            (iVar27 = aiStack_c28[uVar65 * 0xc + 1], aiStack_c18[uVar65 * 0xc] - iVar27 == 1)) &&
           (iVar35 = *(int *)(auStack_c20 + lVar38),
           *(int *)((long)alStack_c10 + lVar38 + -4) - iVar35 == 1)) {
          lVar38 = 0x38;
          do {
            *(undefined8 *)((long)&uStack_1c48 + lVar38) = 0;
            *(undefined4 *)((long)auStack_1c40 + lVar38) = 0;
            *(undefined8 *)(local_1c38 + lVar38) = 0;
            lVar38 = lVar38 + 0x40;
          } while (lVar38 != 0x1038);
          auStack_1c28._0_4_ = (local_3508->field_0).field_0.X;
          iVar36 = 1;
          iVar53 = 1;
          if ((long)(int)auStack_1c28._0_4_ != 0) {
            uVar30 = (long)(int)auStack_1c28._0_4_ - 1;
            lVar38 = 0x3f;
            if (uVar30 != 0) {
              for (; uVar30 >> lVar38 == 0; lVar38 = lVar38 + -1) {
              }
            }
            iVar53 = (int)(1L << (-((byte)lVar38 ^ 0x3f) & 0x3f));
            if (uVar30 == 0) {
              iVar53 = 1;
            }
          }
          auStack_1c28._4_4_ = (local_3508->field_0).field_0.Y;
          if ((long)(int)auStack_1c28._4_4_ != 0) {
            uVar30 = (long)(int)auStack_1c28._4_4_ - 1;
            lVar38 = 0x3f;
            if (uVar30 != 0) {
              for (; uVar30 >> lVar38 == 0; lVar38 = lVar38 + -1) {
              }
            }
            iVar36 = (int)(1L << (-((byte)lVar38 ^ 0x3f) & 0x3f));
            if (uVar30 == 0) {
              iVar36 = 1;
            }
          }
          auStack_1c28._8_4_ = (local_3508->field_0).field_0.Z;
          if ((long)(int)auStack_1c28._8_4_ == 0) {
            iVar59 = 1;
          }
          else {
            uVar30 = (long)(int)auStack_1c28._8_4_ - 1;
            lVar38 = 0x3f;
            if (uVar30 != 0) {
              for (; uVar30 >> lVar38 == 0; lVar38 = lVar38 + -1) {
              }
            }
            iVar59 = (int)(1L << (-((byte)lVar38 ^ 0x3f) & 0x3f));
            if (uVar30 == 0) {
              iVar59 = 1;
            }
          }
          local_1c38._0_8_ = (Idx2_00->ChunksOrderInFile).Arr[local_3780];
          auStack_1c28._0_4_ = auStack_1c28._0_4_ * iVar34;
          auStack_1c28._4_4_ = auStack_1c28._4_4_ * iVar27;
          auStack_1c28._8_4_ = auStack_1c28._8_4_ * iVar35;
          auStack_1c28._16_4_ = iVar36 + auStack_1c28._4_4_;
          auStack_1c28._12_4_ = iVar53 + auStack_1c28._0_4_;
          local_1c38._8_8_ = local_1c38._0_8_;
          iStack_1c14 = iVar59 + auStack_1c28._8_4_;
          uVar30 = 0;
          alStack_1c10[0] = 0;
          alStack_1c10[1] = alStack_1c10[1] & 0xffffffff00000000;
          lStack_1c00._0_1_ = '\0';
          lStack_1c00._1_1_ = '\0';
          lStack_1c00._2_1_ = '\0';
          lStack_1c00._3_1_ = '\0';
          lStack_1c00._4_1_ = '\0';
          lStack_1c00._5_1_ = '\0';
          lStack_1c00._6_1_ = '\0';
          lStack_1c00._7_1_ = '\0';
          do {
            uVar65 = uVar30 & 0xffffffff;
            lVar38 = uVar65 * 0x40;
            puVar64 = (ulong *)(local_1c38 + lVar38);
            uVar57 = *puVar64;
            uVar46 = uVar57 >> 2;
            *puVar64 = uVar46;
            uVar37 = (uint)uVar57 & 3;
            if (uVar37 == 3) {
              if (uVar46 == 3) {
                *puVar64 = *(ulong *)(auStack_1c28 + lVar38 + -8);
              }
              else {
                *(ulong *)(auStack_1c28 + lVar38 + -8) = uVar46;
              }
            }
            else {
              local_35c8 = (ulong)((int)uVar30 - 1);
              iVar34 = *(int *)(auStack_1c28 + lVar38);
              if (((*(int *)(auStack_1c28 + lVar38 + 0xc) - iVar34 == 1) &&
                  (iVar27 = *(int *)(auStack_1c28 + lVar38 + 4),
                  *(int *)(auStack_1c28 + lVar38 + 0x10) - iVar27 == 1)) &&
                 (iVar35 = *(int *)(auStack_1c28 + lVar38 + 8),
                 (&iStack_1c14)[uVar65 * 0x10] - iVar35 == 1)) {
                lVar38 = 0x38;
                do {
                  *(undefined8 *)((long)auStack_2c40 + lVar38 + -8) = 0;
                  *(undefined4 *)((long)auStack_2c40 + lVar38) = 0;
                  *(undefined8 *)((long)local_2c38 + lVar38) = 0;
                  lVar38 = lVar38 + 0x40;
                } while (lVar38 != 0x1038);
                iVar36 = (local_3500->field_0).field_0.X;
                iVar53 = 1;
                iVar59 = 1;
                if ((long)iVar36 != 0) {
                  uVar30 = (long)iVar36 - 1;
                  lVar38 = 0x3f;
                  if (uVar30 != 0) {
                    for (; uVar30 >> lVar38 == 0; lVar38 = lVar38 + -1) {
                    }
                  }
                  iVar59 = (int)(1L << (-((byte)lVar38 ^ 0x3f) & 0x3f));
                  if (uVar30 == 0) {
                    iVar59 = 1;
                  }
                }
                iVar63 = (local_3500->field_0).field_0.Y;
                if ((long)iVar63 != 0) {
                  uVar30 = (long)iVar63 - 1;
                  lVar38 = 0x3f;
                  if (uVar30 != 0) {
                    for (; uVar30 >> lVar38 == 0; lVar38 = lVar38 + -1) {
                    }
                  }
                  iVar53 = (int)(1L << (-((byte)lVar38 ^ 0x3f) & 0x3f));
                  if (uVar30 == 0) {
                    iVar53 = 1;
                  }
                }
                iVar4 = (local_3500->field_0).field_0.Z;
                if ((long)iVar4 == 0) {
                  iVar49 = 1;
                }
                else {
                  uVar30 = (long)iVar4 - 1;
                  lVar38 = 0x3f;
                  if (uVar30 != 0) {
                    for (; uVar30 >> lVar38 == 0; lVar38 = lVar38 + -1) {
                    }
                  }
                  iVar49 = (int)(1L << (-((byte)lVar38 ^ 0x3f) & 0x3f));
                  if (uVar30 == 0) {
                    iVar49 = 1;
                  }
                }
                local_2c38[0] = (Idx2_00->BricksOrderInChunk).Arr[local_3780];
                uStack_2c28._0_4_ = iVar36 * iVar34;
                Val = (brick_volume *)(ulong)(uint)uStack_2c28;
                uStack_2c28._4_4_ = iVar63 * iVar27;
                uStack_2c20 = iVar4 * iVar35;
                local_2c38[1] = local_2c38[0];
                auStack_2c1c._0_4_ = iVar59 + (uint)uStack_2c28;
                auStack_2c1c._4_4_ = iVar53 + uStack_2c28._4_4_;
                uStack_2c14 = iVar49 + uStack_2c20;
                uVar30 = 0;
                lStack_2c10 = 0;
                aiStack_2c08[0] = 0;
                alStack_2c00[0] = 0;
                do {
                  lVar38 = uVar30 * 0x40;
                  puVar64 = local_2c38 + uVar30 * 8;
                  uVar57 = *puVar64;
                  uVar65 = uVar57 >> 2;
                  *puVar64 = uVar65;
                  uVar37 = (uint)uVar57 & 3;
                  if (uVar37 == 3) {
                    if (uVar65 == 3) {
                      *puVar64 = local_2c38[uVar30 * 8 + 1];
                    }
                    else {
                      local_2c38[uVar30 * 8 + 1] = uVar65;
                    }
                  }
                  else {
                    local_36c0 = (ulong)((int)uVar30 - 1);
                    auVar67._8_8_ = 0;
                    auVar67._0_8_ = *(ulong *)(auStack_2c1c + lVar38);
                    auVar68._8_8_ = 0;
                    auVar68._0_8_ = (&uStack_2c28)[uVar30 * 8];
                    auVar3 = vpsubd_avx(auVar67,auVar68);
                    auVar15._4_4_ = uStack_31c4;
                    auVar15._0_4_ = local_31c8;
                    auVar15._8_4_ = uStack_31c0;
                    auVar15._12_4_ = uStack_31bc;
                    auVar3 = vpcmpeqd_avx(auVar3,auVar15);
                    auVar3 = vpmovsxdq_avx(auVar3);
                    uVar42 = vmovmskpd_avx(auVar3);
                    local_3740 = puVar64;
                    if ((((uVar42 & 1) == 0) || ((byte)((byte)uVar42 >> 1) == 0)) ||
                       ((&uStack_2c14)[uVar30 * 0x10] - (&uStack_2c20)[uVar30 * 0x10] != 1)) {
                      local_33c8.Keys = (unsigned_long *)*puVar64;
                      local_33c8.Vals = (brick_volume *)local_2c38[uVar30 * 8 + 1];
                      pbVar12 = (bucket_status *)(&uStack_2c28)[uVar30 * 8];
                      local_33c8.Alloc = (allocator *)(&lStack_2c10)[uVar30 * 8];
                      uStack_3390 = alStack_2c00[uVar30 * 8];
                      local_33c8.LogCapacity._0_4_ = (int)*(undefined8 *)(auStack_2c1c + lVar38 + 4)
                      ;
                      local_33c8.LogCapacity._4_4_ =
                           (uint)((ulong)*(undefined8 *)(auStack_2c1c + lVar38 + 4) >> 0x20);
                      iStack_3398 = (int)*(undefined8 *)(aiStack_2c08 + uVar30 * 0x10);
                      uStack_3394 = (undefined4)
                                    ((ulong)*(undefined8 *)(aiStack_2c08 + uVar30 * 0x10) >> 0x20);
                      local_33c8.Size._0_4_ = (uint)*(undefined8 *)(&uStack_2c20 + uVar30 * 0x10);
                      local_33c8.Size._4_4_ =
                           (int)((ulong)*(undefined8 *)(&uStack_2c20 + uVar30 * 0x10) >> 0x20);
                      local_3108.Key = (unsigned_long *)*puVar64;
                      local_3108.Val = (brick_volume *)local_2c38[uVar30 * 8 + 1];
                      local_3108.Ht =
                           (hash_table<unsigned_long,_idx2::brick_volume> *)
                           (&uStack_2c28)[uVar30 * 8];
                      auVar2 = *(undefined1 (*) [32])(&uStack_2c20 + uVar30 * 0x10);
                      iStack_30e8 = auVar2._8_4_;
                      iStack_30e4 = auVar2._12_4_;
                      ppp_Stack_30e0 = auVar2._16_8_;
                      iStack_30d8 = auVar2._24_4_;
                      uStack_30d4 = auVar2._28_4_;
                      local_3108.Idx._0_4_ = (int)*(undefined8 *)(&uStack_2c20 + uVar30 * 0x10);
                      local_3108.Idx._4_4_ =
                           (int)((ulong)*(undefined8 *)(&uStack_2c20 + uVar30 * 0x10) >> 0x20);
                      uVar57 = (ulong)(uVar37 << 2);
                      iVar34 = *(int *)((long)&uStack_2c28 + uVar57 + lVar38);
                      iVar34 = (*(int *)(auStack_2c1c + uVar57 + lVar38) - iVar34) / 2 + iVar34;
                      *(int *)((long)&local_33c8.Size + uVar57 + 4) = iVar34;
                      paVar8 = local_33c8.Alloc;
                      *(int *)((long)&local_3108.Ht + uVar57) = iVar34;
                      local_33c8.Stats._0_4_ = (int)pbVar12;
                      local_37b0 = (ulong)pbVar12 & 0xffffffff;
                      local_33c8.Stats._4_4_ = (uint)((ulong)pbVar12 >> 0x20);
                      local_3798 = (u64)local_33c8.Stats._4_4_;
                      local_37a8 = (brick_volume *)CONCAT44(local_37a8._4_4_,local_33c8.Size._4_4_);
                      uVar37 = local_33c8.Size._4_4_ - (int)local_33c8.Stats;
                      local_37c8 = CONCAT44(local_37c8._4_4_,(int)local_33c8.LogCapacity);
                      uVar43 = (int)local_33c8.LogCapacity - local_33c8.Stats._4_4_;
                      local_37bc._4_4_ = local_33c8.LogCapacity._4_4_;
                      uVar42 = local_33c8.LogCapacity._4_4_ - (uint)local_33c8.Size;
                      local_37d4 = (uint)local_33c8.Size;
                      local_3498.Vol.Buffer.Data =
                           (byte *)((ulong)((uint)local_33c8.Size & 0x1fffff) << 0x2a |
                                   (local_3798 & 0x1fffff) << 0x15 | (ulong)pbVar12 & 0x1fffff);
                      local_3498.Vol.Buffer.Bytes =
                           (ulong)(uVar42 & 0x1fffff) << 0x2a |
                           (ulong)(uVar43 & 0x1fffff) << 0x15 | (ulong)(uVar37 & 0x1fffff);
                      local_33c8.Stats = pbVar12;
                      eVar70 = Crop<idx2::extent,idx2::extent>((extent *)&local_3498,&local_3568);
                      iVar34 = iStack_3398;
                      uVar31 = eVar70.Dims;
                      ppp_Stack_30e0 =
                           (_func_int ***)
                           ((long)&paVar8->_vptr_allocator +
                           ((long)(uVar31 << 0x16) >> 0x2b) * ((long)(uVar31 << 0x2b) >> 0x2b) *
                           ((long)(uVar31 * 2) >> 0x2b));
                      eVar70 = Crop<idx2::extent,idx2::extent>((extent *)&local_3498,&local_33e8);
                      iStack_30d8 = (((int)eVar70.Dims << 0xb) >> 0xb) *
                                    (int)((long)(eVar70.Dims * 2) >> 0x2b) *
                                    (int)((long)(eVar70.Dims << 0x16) >> 0x2b) + iVar34;
                      uStack_3390 = local_3740[7];
                      lStack_30d0 = (long)(int)uVar42 * (long)(int)uVar43 * (long)(int)uVar37 +
                                    uStack_3390;
                      Val = (brick_volume *)
                            (((long)(local_3568.Dims << 0x16) >> 0xb) +
                            ((long)(local_3568.From << 0x16) >> 0xb & 0xffffffff00000000U));
                      iVar35 = (int)((long)(local_3568.From << 0x2b) >> 0x2b);
                      iVar36 = (((int)local_3568.Dims << 0xb) >> 0xb) + iVar35;
                      iVar34 = (int)((long)(local_3568.From * 2) >> 0x2b);
                      iVar53 = (int)((long)(local_3568.Dims * 2) >> 0x2b) + iVar34;
                      iVar59 = (int)((ulong)Val >> 0x20);
                      iVar27 = (int)((long)(local_3568.From << 0x16) >> 0x2b);
                      uVar57 = local_36c0;
                      if ((((int)local_3108.Ht < iVar36) && (local_3108.Ht._4_4_ < iVar59)) &&
                         ((((int)local_3108.Idx < iVar53 &&
                           ((iVar35 < local_3108.Idx._4_4_ && (iVar27 < iStack_30e8)))) &&
                          (iVar34 < iStack_30e4)))) {
                        auVar16._4_4_ = iStack_30e4;
                        auVar16._0_4_ = iStack_30e8;
                        auVar16._8_8_ = ppp_Stack_30e0;
                        auVar16._16_4_ = iStack_30d8;
                        auVar16._20_4_ = uStack_30d4;
                        auVar16._24_8_ = lStack_30d0;
                        *(undefined1 (*) [32])(local_3740 + 4) = auVar16;
                        *local_3740 = (ulong)local_3108.Key;
                        local_3740[1] = (ulong)local_3108.Val;
                        local_3740[2] = (ulong)local_3108.Ht;
                        local_3740[3] = CONCAT44(local_3108.Idx._4_4_,(int)local_3108.Idx);
                        uVar57 = uVar30;
                      }
                      uVar30 = uVar57;
                      Idx2_00 = local_37d0;
                      if ((int)local_37b0 < iVar36) {
                        Val = (brick_volume *)((ulong)Val >> 0x20);
                        if (((((int)local_3798 < iVar59) && ((int)local_37d4 < iVar53)) &&
                            (iVar35 < (int)local_37a8)) &&
                           (iVar34 < (int)local_37bc._4_4_ && iVar27 < (int)local_37c8)) {
                          uVar30 = (ulong)((int)uVar57 + 1);
                          auVar14._4_4_ = local_33c8.LogCapacity._4_4_;
                          auVar14._0_4_ = (int)local_33c8.LogCapacity;
                          auVar14._8_8_ = local_33c8.Alloc;
                          auVar14._16_4_ = iStack_3398;
                          auVar14._20_4_ = uStack_3394;
                          auVar14._24_8_ = uStack_3390;
                          *(undefined1 (*) [32])(auStack_2c1c + uVar30 * 0x40 + 4) = auVar14;
                          local_2c38[uVar30 * 8] = (ulong)local_33c8.Keys;
                          local_2c38[uVar30 * 8 + 1] = (ulong)local_33c8.Vals;
                          (&uStack_2c28)[uVar30 * 8] = local_33c8.Stats;
                          *(ulong *)(&uStack_2c20 + uVar30 * 0x10) =
                               CONCAT44(local_33c8.Size._4_4_,(uint)local_33c8.Size);
                        }
                      }
                    }
                    else {
                      local_366c = aiStack_2c08[uVar30 * 0x10];
                      if (Mallocator()::Instance == '\0') {
                        Decode();
                      }
                      local_3498.Vol.Buffer.Data = (byte *)0x0;
                      local_3498.Vol.Buffer.Bytes = 0;
                      local_3498.Vol.Buffer.Alloc = (allocator *)&Mallocator()::Instance;
                      local_3498.Vol.Dims = 0;
                      local_3498.Vol.Type = __Invalid__;
                      local_3498.ExtentLocal.From = 0;
                      local_3498.ExtentLocal.Dims = 0;
                      local_3498.NChildrenDecoded = '\0';
                      local_3498.NChildrenMax = '\0';
                      local_3498.Significant = false;
                      local_3498.DoneDecoding = false;
                      Resize(&local_3498.Vol,local_35a8,float64,(allocator *)local_2ec8._0_8_);
                      lVar47 = (long)(local_3498.Vol.Dims * 2) >> 0x2b;
                      lVar38 = (long)(local_3498.Vol.Dims << 0x16) >> 0x2b;
                      if (lVar38 != 0 && (lVar47 != 0 && (local_3498.Vol.Dims & 0x1fffff) != 0)) {
                        memset(local_3498.Vol.Buffer.Data,0,
                               lVar47 * lVar38 * ((long)(local_3498.Vol.Dims << 0x2b) >> 0x2b) * 8);
                      }
                      local_3670 = (int)local_3740[2];
                      iVar34 = *(int *)((long)local_3740 + 0x14);
                      local_3758 = (uint)local_3740[3];
                      Brick3.field_0.field_0.Y = 0;
                      Brick3.field_0.field_0.X = local_3758;
                      Brick3.field_0._8_4_ = SUB84(Val,0);
                      local_3798 = GetLinearBrick((idx2 *)Idx2_00,(idx2_file *)(ulong)local_3788,
                                                  (int)local_3740[2],Brick3);
                      Brick3_00.field_0._0_8_ = (unsigned_long *)(local_3798 * 0x10 + local_3780);
                      Key = &local_3498;
                      local_36a0 = (undefined1  [8])Brick3_00.field_0._0_8_;
                      Insert<unsigned_long,idx2::brick_volume>
                                (&local_2ee8,(idx2 *)(local_2ec8 + 0x38),
                                 (hash_table<unsigned_long,_idx2::brick_volume> *)local_36a0,
                                 (unsigned_long *)Key,Val);
                      local_33c8.Keys = Brick3_00.field_0._0_8_;
                      Lookup<unsigned_long,idx2::brick_volume>
                                (&local_3128,(idx2 *)(local_2ec8 + 0x38),&local_33c8,
                                 (unsigned_long *)Key);
                      local_35a0 = local_3128.Val;
                      local_3458.LogCapacity = 0;
                      local_3458.Alloc = (allocator *)0x0;
                      local_3458.Keys = (short *)0x0;
                      local_3458.Vals = (bitstream *)0x0;
                      local_3458.Stats = (bucket_status *)0x0;
                      local_3458.Size = 0;
                      if (Mallocator()::Instance == '\0') {
                        Decode();
                      }
                      Init<short,idx2::bitstream>
                                (&local_3458,7,(allocator *)&Mallocator()::Instance);
                      iVar32 = (Idx2_00->Subbands).Size;
                      if ((char)iVar32 != '\0') {
                        uVar37 = 0;
                        local_37c0 = 0;
                        local_3754 = iVar34;
                        do {
                          iVar27 = local_3670;
                          if (((Idx2_00->DecodeSubbandMasks).Arr[local_3780] >> (uVar37 & 0x1f) & 1)
                              != 0) {
                            local_34c8 = (long)(char)local_37c0;
                            pbVar56 = (Idx2_00->Subbands).Buffer.Data;
                            local_36b8 = (i64 *)(pbVar56 + local_34c8 * 0x40);
                            lVar38 = *(long *)(pbVar56 + local_34c8 * 0x40 + 8);
                            local_36f0 = (lVar38 << 0x2b) >> 0x2b;
                            local_36e8 = lVar38 * 2 >> 0x2b;
                            bVar9 = 1 < (long)local_36f0;
                            uVar30 = (ulong)((lVar38 << 0x16) >> 0xb) >> 0x20;
                            bVar10 = 1 < (long)local_36e8;
                            cVar51 = Idx2_00->NLevels;
                            Idx2_00 = local_37d0;
                            local_3730 = uVar30;
                            if (((char)local_37c0 == '\0') && (local_37d6 < cVar51)) {
                              local_37b0 = CONCAT71(local_37b0._1_7_,
                                                    1 < (int)((lVar38 << 0x16) >> 0x2b));
                              Brick3_00.field_0._0_8_ =
                                   (unsigned_long *)
                                   ((long)(int)local_3758 /
                                    (long)(local_37d0->GroupBrick3).field_0.field_0.Z & 0xffffffff);
                              Brick3_00.field_0._8_4_ =
                                   (int)((long)local_3670 /
                                        (long)(local_37d0->GroupBrick3).field_0.field_0.X);
                              uVar31 = GetLinearBrick((idx2 *)local_37d0,
                                                      (idx2_file *)(ulong)local_3674,
                                                      Brick3_00.field_0._8_4_,Brick3_00);
                              local_37a8 = (brick_volume *)CONCAT71(local_37a8._1_7_,bVar10);
                              local_37d4 = CONCAT31(local_37d4._1_3_,bVar9);
                              local_3648._0_8_ = uVar31 * 0x10 + local_34d8;
                              Lookup<unsigned_long,idx2::brick_volume>
                                        ((iterator *)&local_33c8,(idx2 *)(local_2ec8 + 0x38),
                                         (hash_table<unsigned_long,_idx2::brick_volume> *)local_3648
                                         ,Brick3_00.field_0._0_8_);
                              uVar44 = local_3758;
                              Idx2_00 = local_37d0;
                              uVar37 = (local_37d0->GroupBrick3).field_0.field_0.X;
                              uVar42 = (local_37d0->GroupBrick3).field_0.field_0.Y;
                              uVar43 = (local_37d0->GroupBrick3).field_0.field_0.Z;
                              local_3108.Key =
                                   (unsigned_long *)
                                   ((ulong)(local_3758 - (int)local_3758 % (int)uVar43 & 0x1fffff)
                                    << 0x2a |
                                   (ulong)(iVar34 - iVar34 % (int)uVar42 & 0x1fffff) << 0x15 |
                                   (ulong)(iVar27 - iVar27 % (int)uVar37 & 0x1fffff));
                              local_3108.Val =
                                   (brick_volume *)
                                   ((ulong)(uVar43 & 0x1fffff) << 0x2a |
                                   ((ulong)uVar42 & 0x1fffff) << 0x15 | (ulong)uVar37 & 0x1fffff);
                              local_3628._vptr_expected = (_func_int **)0x0;
                              local_3628.field_1.Val =
                                   (chunk_exp_cache *)
                                   ((ulong)((local_34e0->field_0).field_0.Z & 0x1fffff) << 0x2a |
                                   ((ulong)(uint)(local_34e0->field_0).field_0.Y & 0x1fffff) << 0x15
                                   | (ulong)(uint)(local_34e0->field_0).field_0.X & 0x1fffff);
                              eVar70 = Crop<idx2::extent,idx2::extent>
                                                 ((extent *)&local_3108,(extent *)&local_3628);
                              uVar43 = (int)local_36f0 - (local_37d4 & 0xff);
                              uVar42 = (int)local_3730 - (uint)(byte)local_37b0;
                              uVar37 = (int)local_36e8 - (uint)(byte)local_37a8;
                              local_3628._vptr_expected = (_func_int **)*local_36b8;
                              local_3628.field_1._8_8_ = local_36b8[2];
                              local_3698.Val =
                                   (bitstream *)
                                   ((ulong)(uVar37 & 0x1fffff) << 0x2a |
                                   (ulong)(uVar42 & 0x1fffff) << 0x15 | (ulong)(uVar43 & 0x1fffff));
                              local_3698.Key =
                                   (short *)((ulong)(((int)uVar44 %
                                                     (Idx2_00->GroupBrick3).field_0.field_0.Z) *
                                                     uVar37 & 0x1fffff) << 0x2a |
                                            (ulong)((local_3754 %
                                                    (Idx2_00->GroupBrick3).field_0.field_0.Y) *
                                                    uVar42 & 0x1fffff) << 0x15 |
                                            (ulong)((iVar27 % (Idx2_00->GroupBrick3).field_0.field_0
                                                              .X) * uVar43 & 0x1fffff));
                              local_3628.field_1.Val = (chunk_exp_cache *)local_3698.Val;
                              CopyExtentGrid<double,double>
                                        ((extent *)(local_36a0 + 8),&(local_33c8.Vals)->Vol,
                                         (grid *)&local_3628,&local_35a0->Vol);
                              if (((iVar27 == (((int)eVar70.Dims << 0xb) >> 0xb) +
                                              (((int)eVar70.From << 0xb) >> 0xb) + -1) &&
                                  ((uVar30 = ((long)(eVar70.Dims << 0x16) >> 0xb) + -0x100000000 +
                                             ((long)(eVar70.From << 0x16) >> 0xb &
                                             0xffffffff00000000U),
                                   Brick3_00.field_0._0_8_ = (unsigned_long *)(uVar30 >> 0x20),
                                   local_3754 == (int)(uVar30 >> 0x20) &&
                                   (((int)((long)(eVar70.Dims * 2) >> 0x2b) +
                                    (int)((long)(eVar70.From * 2) >> 0x2b)) - 1U == local_3758))))
                                 && ((local_37a0->OutMode != HashMap ||
                                     ((local_33c8.Vals)->Significant == false)))) {
                                Dealloc(local_33c8.Vals);
                                Delete<unsigned_long,idx2::brick_volume>
                                          (&local_3108,(idx2 *)(local_2ec8 + 0x38),
                                           (hash_table<unsigned_long,_idx2::brick_volume> *)
                                           local_3648,Brick3_00.field_0._0_8_);
                              }
                              lVar38 = local_36b8[1];
                              local_36e8 = lVar38 * 2 >> 0x2b;
                              local_36f0 = (ulong)(uint)(((int)lVar38 << 0xb) >> 0xb);
                              uVar30 = (ulong)((lVar38 << 0x16) >> 0xb) >> 0x20;
                              cVar51 = Idx2_00->NLevels;
                            }
                            iVar34 = (Idx2_00->BlockDims3).field_0.field_0.X;
                            iVar27 = (Idx2_00->BlockDims3).field_0.field_0.Y;
                            iVar35 = (Idx2_00->BlockDims3).field_0.field_0.Z;
                            uVar57 = (long)((int)local_36f0 + iVar34 + -1) / (long)iVar34;
                            local_36d8 = uVar57 & 0xffffffff;
                            uVar65 = (long)((int)uVar30 + -1 + iVar27) / (long)iVar27;
                            local_3588 = uVar65 & 0xffffffff;
                            uVar46 = (long)((int)local_36e8 + iVar35 + -1) / (long)iVar35;
                            local_3590 = uVar46 & 0xffffffff;
                            iVar36 = (int)uVar57 * (int)uVar46 * (int)uVar65;
                            local_37a8 = local_3128.Val;
                            if (((char)local_37c0 == '\0') && (local_3790 < cVar51)) {
                              iVar36 = iVar36 - (int)((long)((ulong)(uint)((int)local_36e8 >> 0x1f)
                                                             << 0x20 | local_36e8 & 0xffffffff) /
                                                     (long)iVar35) *
                                                (int)((long)((ulong)(uint)((int)local_36f0 >> 0x1f)
                                                             << 0x20 | local_36f0 & 0xffffffff) /
                                                     (long)iVar34) * ((int)uVar30 / iVar27);
                            }
                            Val = (brick_volume *)(ulong)local_3788;
                            local_36b0 = CONCAT44(local_36b0._4_4_,(int)(char)local_37c0);
                            ReadChunkExponents(&local_3628,Idx2_00,(decode_data *)local_2ec8,
                                               local_3798,(i8)local_3788,(char)local_37c0);
                            local_3730 = uVar30;
                            if (local_3628.Ok != true) {
                              uVar37 = (uint)local_3628.field_1._8_8_;
                              uVar62 = local_3628.field_1.Val;
                              goto LAB_0017a9a7;
                            }
                            bVar25 = Idx2_00->DType - int64;
                            bVar26 = 0;
                            if (bVar25 < 4) {
                              bVar26 = (byte)*(undefined4 *)(&DAT_001a84a0 + (ulong)bVar25 * 4);
                            }
                            iVar34 = iVar36 * local_366c << (bVar26 & 0x1f);
                            pbVar56 = ((local_3628.field_1.Val)->ChunkExpStream).Stream.Data;
                            local_36e0 = *(ulong *)(pbVar56 + iVar34);
                            local_3458.Size = 0;
                            if (local_3458.LogCapacity != 0x3f) {
                              memset(local_3458.Stats,0,1L << ((byte)local_3458.LogCapacity & 0x3f))
                              ;
                            }
                            local_36f8 = pbVar56 + iVar34;
                            uVar43 = (int)local_36d8 - 1;
                            uVar42 = (int)local_3588 - 1;
                            uVar37 = (int)local_3590 - 1;
                            uVar43 = (uVar43 * 0x100 & 0xffff | uVar43 * 0x10000 | uVar43 & 0xff) &
                                     0x300f00f;
                            uVar42 = (uVar42 * 0x100 & 0xffff | uVar42 * 0x10000 | uVar42 & 0xff) &
                                     0x300f00f;
                            uVar37 = (uVar37 * 0x100 & 0xffff | uVar37 * 0x10000 | uVar37 & 0xff) &
                                     0x300f00f;
                            local_364c = ((uVar37 << 4 | uVar37) & 0x30c30c3) * 0x14 & 0x24924924 |
                                         ((uVar42 << 4 | uVar42) & 0x30c30c3) * 10 & 0x12492492 |
                                         ((uVar43 << 4 | uVar43) & 0x30c30c3) * 5 & 0x9249249;
                            uVar30 = 0;
                            local_378c = 0;
                            local_3750 = 0;
                            do {
                              uVar37 = (uint)uVar30;
                              uVar43 = (uVar37 & 0x9249249) >> 2 | uVar37 & 0x9249249;
                              uVar42 = uVar43 & 0x30c30c3;
                              uVar42 = (uVar42 >> 4 | uVar42) & 0x300f00f;
                              uVar42 = (uVar43 >> 0x10 & 0x300 | uVar42 >> 8 | uVar42) & 0x3ff;
                              if ((int)local_36d8 <= (int)uVar42) {
LAB_00179721:
                                iVar34 = 0;
                                if (uVar37 != 0) {
                                  for (; (uVar37 >> iVar34 & 1) == 0; iVar34 = iVar34 + 1) {
                                  }
                                }
                                bVar26 = (char)iVar34 + 1;
                                if (uVar37 == 0) {
                                  bVar26 = (byte)uVar30;
                                }
                                uVar37 = (uVar37 >> (bVar26 & 0x1f)) + 1 << (bVar26 & 0x1f);
                                goto LAB_0017a59d;
                              }
                              uVar60 = (uint)(uVar30 >> 1) & 0x9249249;
                              local_34a0 = (ulong)(uVar60 >> 2);
                              uVar44 = (uVar60 >> 2) + uVar60;
                              uVar43 = uVar44 & 0x30c30c3;
                              local_3650 = (uVar43 >> 4 | uVar43) & 0x300f00f;
                              local_3654 = local_3650 >> 8;
                              uVar43 = (uVar44 >> 0x10 & 0x300 | local_3654 | local_3650) & 0x3ff;
                              if ((int)local_3588 <= (int)uVar43) goto LAB_00179721;
                              uVar44 = (uint)(uVar30 >> 2) & 0x9249248;
                              local_34a8 = (ulong)uVar44;
                              uVar61 = uVar37 & 0x24924924;
                              uVar44 = uVar44 + uVar61;
                              uVar52 = uVar44 >> 2 & 0x30c30c3;
                              uVar45 = (uVar52 >> 4 | uVar52) & 0x300f00f;
                              uVar52 = uVar45 >> 8;
                              uVar44 = (uVar44 >> 0x12 & 0x300 | uVar52 | uVar45) & 0x3ff;
                              if ((int)local_3590 <= (int)uVar44) goto LAB_00179721;
                              iVar34 = (Idx2_00->BlockDims3).field_0.field_0.X;
                              local_370c = (Idx2_00->BlockDims3).field_0.field_0.Y;
                              local_3710 = (Idx2_00->BlockDims3).field_0.field_0.Z;
                              iVar35 = uVar44 * local_3710;
                              iVar53 = uVar42 * iVar34;
                              local_3728 = CONCAT44(local_3728._4_4_,iVar53);
                              iVar36 = uVar43 * local_370c;
                              pbVar56 = (local_34d0->Buffer).Data;
                              local_3784 = CONCAT31(local_3784._1_3_,
                                                    (iVar36 % *(int *)(pbVar56 +
                                                                      local_34c8 * 0xc + 4) != 0 ||
                                                    iVar53 % *(int *)(pbVar56 + local_34c8 * 0xc) !=
                                                    0) || iVar35 % *(int *)(pbVar56 +
                                                                           local_34c8 * 0xc + 8) !=
                                                          0);
                              iVar53 = (int)local_36f0 - iVar53;
                              iVar36 = (int)local_3730 - iVar36;
                              iVar35 = (int)local_36e8 - iVar35;
                              iVar27 = iVar34;
                              if (iVar53 < iVar34) {
                                iVar27 = iVar53;
                              }
                              local_37b0 = CONCAT44(local_37b0._4_4_,iVar27);
                              iVar59 = local_370c;
                              if (iVar36 < local_370c) {
                                iVar59 = iVar36;
                              }
                              local_3768 = CONCAT44(local_3768._4_4_,iVar59);
                              iVar63 = local_3710;
                              if (iVar35 < local_3710) {
                                iVar63 = iVar35;
                              }
                              local_365c = uVar52;
                              local_3658 = uVar45;
                              local_34c0 = (ulong)uVar61;
                              local_34b8 = (ulong)uVar60;
                              if (((((char)local_37c0 == '\0') && (local_3790 < Idx2_00->NLevels))
                                  && (iVar34 <= iVar53)) &&
                                 ((local_370c <= iVar36 && (local_3710 <= iVar35))))
                              goto LAB_0017a59a;
                              uVar42 = (uint)(1 < iVar63) + (uint)(1 < iVar59) + (uint)(1 < iVar27);
                              local_37c8 = (ulong)(uint)(1 << (char)uVar42 * '\x02');
                              local_3660 = iVar63;
                              memset(&local_3108,0,0x200);
                              dVar41 = Idx2_00->DType;
                              if ((dVar41 < 10) && ((0x2c0U >> (dVar41 & 0x1f) & 1) != 0)) {
                                if (0x30 < (int)local_378c) {
                                  local_36e0 = *(ulong *)(local_36f8 + (local_378c >> 3));
                                  local_36f8 = local_36f8 + (local_378c >> 3);
                                  local_378c = local_378c & 7;
                                }
                                uVar48 = (ushort)(local_36e0 >> ((byte)local_378c & 0x3f)) &
                                         (ushort)bitstream::Masks.Arr[0x10];
                                local_378c = local_378c + 0x10;
                                iVar34 = -0x3ff;
                              }
                              else {
                                if (0x38 < (int)local_378c) {
                                  local_36e0 = *(ulong *)(local_36f8 + (local_378c >> 3));
                                  local_36f8 = local_36f8 + (local_378c >> 3);
                                  local_378c = local_378c & 7;
                                }
                                uVar48 = (ushort)(local_36e0 >> ((byte)local_378c & 0x3f)) &
                                         (ushort)bitstream::Masks.Arr[8];
                                local_378c = local_378c + 8;
                                iVar34 = -0x7f;
                              }
                              local_37d5 = '\0';
                              switch(dVar41) {
                              case int8:
                              case uint8:
                                local_3770 = CONCAT44(local_3770._4_4_,0x38);
                                break;
                              case int16:
                              case uint16:
                                local_3770 = CONCAT44(local_3770._4_4_,0x30);
                                break;
                              case int32:
                              case uint32:
                              case float32:
                                local_3770 = CONCAT44(local_3770._4_4_,0x20);
                                break;
                              case int64:
                              case uint64:
                              case float64:
                                bVar9 = false;
                                local_3770 = (ulong)local_3770._4_4_ << 0x20;
                                goto LAB_00179821;
                              default:
                                local_3770 = CONCAT44(local_3770._4_4_,0x40);
                                bVar9 = true;
                                goto LAB_00179821;
                              }
                              bVar9 = false;
LAB_00179821:
                              local_3598 = (ulong)uVar42;
                              if ((local_3580 != 0.0) || (NAN(local_3580))) {
                                frexp(local_3580,(int *)(local_36a0 + 8));
                                iVar27 = (int)local_3698.Key;
                                if ((int)local_3698.Key < -0x3fd) {
                                  iVar27 = -0x3fe;
                                }
                                local_3738 = CONCAT44(local_3738._4_4_,iVar27 + -6);
                              }
                              else {
                                local_3738 = CONCAT44(local_3738._4_4_,0xfffffbfb);
                              }
                              if (!bVar9) {
                                local_3664 = (uint)local_3598 ^ 0x3f;
                                Key_00 = (short *)(ulong)(uint)((short)uVar48 + iVar34);
                                local_3668 = (int)(short)((short)uVar48 + iVar34);
                                local_3738 = CONCAT44(local_3738._4_4_,(int)local_3738 - local_3668)
                                ;
                                local_374c = Idx2_00->BitPlanesPerChunk;
                                iVar34 = (int)local_37c8;
                                cVar51 = '?';
                                iVar27 = 0x3f;
                                local_3778 = local_3778 & 0xffffffff00000000;
                                local_37d4 = uVar37;
                                local_3720 = Key_00;
                                do {
                                  iVar36 = (int)(short)((short)local_3720 + (short)iVar27);
                                  iVar35 = iVar36 + 0x400;
                                  local_37bc._0_2_ = (undefined2)(iVar35 / local_374c);
                                  iVar35 = iVar35 % local_374c;
                                  if ((local_3580 != 0.0) || (NAN(local_3580))) {
                                    frexp(local_3580,(int *)(local_36a0 + 8));
                                    Key_00 = (short *)0xfffffc02;
                                    iVar53 = (int)local_3698.Key;
                                    if ((int)local_3698.Key < -0x3fd) {
                                      iVar53 = -0x3fe;
                                    }
                                  }
                                  else {
                                    iVar53 = -0x3ff;
                                  }
                                  iVar36 = iVar36 - iVar53;
                                  if ((iVar36 < 0x39) && (iVar35 == 0)) break;
                                  Lookup<short,idx2::bitstream>
                                            ((iterator *)(local_36a0 + 8),(idx2 *)&local_3458,
                                             (hash_table<short,_idx2::bitstream> *)local_37bc,Key_00
                                            );
                                  if (*(char *)(*(long *)((long)local_3698.Ht + 0x10) +
                                               local_3698.Idx) == '\x02') {
                                    local_37bc._4_4_ =
                                         (undefined4)
                                         ((bitstream *)((long)local_3698.Val + 8))->BitBuf;
                                  }
                                  else {
                                    ReadChunk((expected<const_idx2::chunk_cache_*,_idx2::idx2_err_code>
                                               *)local_3648,local_37d0,(decode_data *)local_2ec8,
                                              local_3798,(i8)local_3788,(i8)local_36b0,
                                              local_37bc._0_2_);
                                    if (local_3630 != true) break;
                                    puVar64 = (ulong *)(((array<unsigned_long> *)
                                                        (local_3648._8_8_ + 8))->Buffer).Data;
                                    puVar39 = puVar64 + ((array<unsigned_long> *)
                                                        (local_3648._8_8_ + 8))->Size;
                                    puVar54 = puVar64;
                                    while (puVar54 < puVar39) {
                                      while( true ) {
                                        puVar1 = (ulong *)((long)puVar54 +
                                                          (((long)puVar39 - (long)puVar54 >> 3) -
                                                           ((long)puVar39 - (long)puVar54 >> 0x3f) &
                                                          0xfffffffffffffffeU) * 4);
                                        if (local_3798 <= *puVar1) break;
                                        puVar54 = puVar1 + 1;
                                        if (puVar39 <= puVar54) goto LAB_00179a2a;
                                      }
                                      puVar39 = puVar1;
                                      if (*puVar1 <= local_3798) break;
                                    }
LAB_00179a2a:
                                    lVar47 = (long)*(int *)((((array<int> *)
                                                             (local_3648._8_8_ + 0x38))->Buffer).
                                                            Data + ((long)puVar39 - (long)puVar64 >>
                                                                   1));
                                    Insert<short,idx2::bitstream>
                                              ((iterator *)(local_36a0 + 8),(short *)local_37bc,
                                               (bitstream *)(local_3648._8_8_ + 0x68));
                                    lVar38 = *(long *)local_3698.Val;
                                    (((bitstream *)((long)local_3698.Val + 8))->Stream).Alloc =
                                         (allocator *)(lVar38 + lVar47);
                                    ((bitstream *)((long)local_3698.Val + 8))->BitPtr =
                                         *(byte **)(lVar38 + lVar47);
                                    *(undefined4 *)
                                     &((bitstream *)((long)local_3698.Val + 8))->BitBuf = 0;
                                    local_37bc._4_4_ = 0;
                                  }
                                  pbVar18 = local_3698.Val;
                                  local_36a8 = CONCAT71(local_36a8._1_7_,0x38 < iVar36);
                                  lVar38 = *(long *)local_3698.Val;
                                  paVar8 = (((bitstream *)((long)local_3698.Val + 8))->Stream).Alloc
                                  ;
                                  if ((int)local_3738 < 8) {
                                    Decode<unsigned_long>
                                              ((unsigned_long *)&local_3108,(int)local_37c8,iVar27,
                                               &local_37d5,local_3698.Val,(bool)(byte)local_3784);
                                    paVar55 = (((bitstream *)((long)pbVar18 + 8))->Stream).Alloc;
                                    uVar43 = (uint)((bitstream *)((long)pbVar18 + 8))->BitBuf;
                                  }
                                  else {
                                    local_3648._16_8_ =
                                         (((bitstream *)((long)local_3698.Val + 8))->Stream).Bytes;
                                    local_3648._0_8_ = *(undefined8 *)local_3698.Val;
                                    local_3648._8_8_ =
                                         (((bitstream *)((long)local_3698.Val + 8))->Stream).Data;
                                    pbVar56 = ((bitstream *)((long)local_3698.Val + 8))->BitPtr;
                                    uVar37 = (uint)local_37d5;
                                    paVar55 = paVar8;
                                    uVar42 = uVar37;
                                    if ((int)uVar37 < 1) {
                                      Brick3_00.field_0._0_8_ = (unsigned_long *)0x0;
                                      uVar43 = local_37bc._4_4_;
                                    }
                                    else {
                                      uVar44 = 0x40 - local_37bc._4_4_;
                                      uVar43 = uVar37;
                                      if ((int)uVar44 < (int)uVar37) {
                                        uVar43 = uVar44;
                                      }
                                      if (0x40 < (int)uVar43) {
LAB_0017aea9:
                                        pcVar40 = 
                                        "t &idx2::stack_array<unsigned long, 65>::operator[](int) const [t = unsigned long, N = 65]"
                                        ;
                                        goto LAB_0017aebe;
                                      }
                                      Brick3_00.field_0._0_8_ =
                                           (unsigned_long *)
                                           ((ulong)pbVar56 >> ((byte)local_37bc._4_4_ & 0x3f) &
                                           bitstream::Masks.Arr[(int)uVar43]);
                                      uVar43 = uVar43 + local_37bc._4_4_;
                                      iVar35 = uVar37 - uVar44;
                                      if (iVar35 != 0 && (int)uVar44 <= (int)uVar37) {
                                        if (0x40 < iVar35) goto LAB_0017aea9;
                                        local_34b0 = (long)((int)uVar43 >> 3);
                                        pbVar56 = *(byte **)((long)&paVar8->_vptr_allocator +
                                                            local_34b0);
                                        Brick3_00.field_0._0_8_ =
                                             (unsigned_long *)
                                             ((ulong)Brick3_00.field_0._0_8_ |
                                             ((ulong)pbVar56 >> (sbyte)(uVar43 & 7) &
                                             bitstream::Masks.Arr[iVar35]) << ((byte)uVar44 & 0x3f))
                                        ;
                                        paVar55 = (allocator *)
                                                  ((long)&paVar8->_vptr_allocator + local_34b0);
                                        uVar43 = (uVar43 & 7) + iVar35;
                                      }
                                    }
                                    while ((int)uVar42 < (int)local_37c8) {
                                      if (0x3f < (int)uVar43) {
                                        pbVar56 = *(byte **)((long)&paVar55->_vptr_allocator +
                                                            (ulong)(uVar43 >> 3));
                                        paVar55 = (allocator *)
                                                  ((long)&paVar55->_vptr_allocator +
                                                  (ulong)(uVar43 >> 3));
                                        uVar43 = uVar43 & 7;
                                      }
                                      bVar26 = (byte)uVar43;
                                      uVar43 = uVar43 + 1;
                                      if (((ulong)pbVar56 >> (bVar26 & 0x3f) &
                                          bitstream::Masks.Arr[1]) == 0) break;
                                      while (bVar26 = (byte)uVar37, (int)(char)bVar26 < iVar34 + -1)
                                      {
                                        if (0x3f < (int)uVar43) {
                                          pbVar56 = *(byte **)((long)&paVar55->_vptr_allocator +
                                                              (ulong)(uVar43 >> 3));
                                          paVar55 = (allocator *)
                                                    ((long)&paVar55->_vptr_allocator +
                                                    (ulong)(uVar43 >> 3));
                                          uVar43 = uVar43 & 7;
                                        }
                                        bVar25 = (byte)uVar43;
                                        uVar43 = uVar43 + 1;
                                        if (((ulong)pbVar56 >> (bVar25 & 0x3f) &
                                            bitstream::Masks.Arr[1]) != 0) break;
                                        uVar37 = (uint)(byte)(bVar26 + 1);
                                      }
                                      uVar37 = uVar37 + 1;
                                      local_37d5 = (i8)uVar37;
                                      Brick3_00.field_0._0_8_ =
                                           (unsigned_long *)
                                           ((long)Brick3_00.field_0._0_8_ + (1L << (bVar26 & 0x3f)))
                                      ;
                                      uVar42 = (int)local_37d5;
                                    }
                                    (&local_3108.Key)[0x3f - iVar27] = Brick3_00.field_0._0_8_;
                                    (((bitstream *)((long)local_3698.Val + 8))->Stream).Bytes =
                                         local_3648._16_8_;
                                    *(undefined8 *)local_3698.Val = local_3648._0_8_;
                                    (((bitstream *)((long)local_3698.Val + 8))->Stream).Data =
                                         (byte *)local_3648._8_8_;
                                    (((bitstream *)((long)local_3698.Val + 8))->Stream).Alloc =
                                         paVar55;
                                    ((bitstream *)((long)local_3698.Val + 8))->BitPtr = pbVar56;
                                    *(uint *)&((bitstream *)((long)local_3698.Val + 8))->BitBuf =
                                         uVar43;
                                  }
                                  Key_00 = (short *)(long)(int)local_37bc._4_4_;
                                  LOCK();
                                  local_2c60._M_i =
                                       local_2c60._M_i +
                                       ((long)(int)uVar43 - (long)Key_00) +
                                       ((long)paVar55 +
                                       (lVar38 - ((long)&paVar8->_vptr_allocator + *(long *)pbVar18)
                                       )) * 8;
                                  UNLOCK();
                                  local_3778 = CONCAT44(local_3778._4_4_,
                                                        CONCAT31((int3)(local_3778 >> 8),
                                                                 (char)local_3778 + (char)local_36a8
                                                                ));
                                  cVar51 = cVar51 + -1;
                                  iVar27 = (int)cVar51;
                                } while ((int)local_3770 <= iVar27);
                                bVar26 = (byte)local_3784 | (char)local_3778 < '\x01';
                                local_3784 = CONCAT31(local_3784._1_3_,bVar26);
                                Idx2_00 = local_37d0;
                                uVar37 = local_37d4;
                                if (bVar26 == 0) {
                                  if (7 < (int)local_3738) {
                                    TransposeRecursive<unsigned_long>
                                              ((unsigned_long *)&local_3108,(int)(char)local_3778);
                                  }
                                  LOCK();
                                  _Stack_2c50._M_i = _Stack_2c50._M_i + 1;
                                  UNLOCK();
                                  eVar71 = (error<idx2::idx2_err_code>)
                                           (*(code *)(&DAT_001a80d8 +
                                                     *(int *)(&DAT_001a80d8 +
                                                             (local_3598 & 0xffffffff) * 4)))();
                                  return eVar71;
                                }
                              }
LAB_0017a59a:
                              uVar37 = uVar37 + 1;
LAB_0017a59d:
                              uVar30 = (ulong)uVar37;
                            } while (uVar37 <= local_364c);
                            bVar26 = (byte)local_3750;
                            LOCK();
                            _Stack_2c48._M_i = _Stack_2c48._M_i + (ulong)(bVar26 ^ 1);
                            UNLOCK();
                            if ((local_3128.Val)->Significant != false) {
                              bVar26 = true;
                            }
                            (local_3128.Val)->Significant = (bool)bVar26;
                            iVar32 = (Idx2_00->Subbands).Size;
                            iVar34 = local_3754;
                          }
                          cVar51 = (char)local_37c0 + '\x01';
                          local_37c0 = CONCAT31((int3)((uint)local_37c0 >> 8),cVar51);
                          uVar37 = (uint)cVar51;
                        } while ((int)(char)iVar32 != uVar37);
                      }
                      Val = local_35a0;
                      InverseCdf53(local_35a8,local_3788,local_34e8,local_34f0,&local_35a0->Vol,
                                   local_3790 == Idx2_00->NLevels);
                      *local_35b0 = 
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Decode.cpp"
                      ;
                      *local_35b8 = 0x140;
                      uVar37 = 0;
                      uVar62 = (chunk_exp_cache *)0x1a9652;
LAB_0017a9a7:
                      Dealloc<short,idx2::bitstream>(&local_3458);
                      Idx2_00 = local_37d0;
                      if ((char)uVar37 != '\0') {
                        cVar51 = (char)(uVar37 >> 8);
                        if ('?' < cVar51) {
                          __assert_fail("false && \"stack too deep\"",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Decode.cpp"
                                        ,0x1aa,
                                        "auto idx2::Decode(const idx2_file &, const params &, buffer *)::(anonymous class)::operator()() const"
                                       );
                        }
                        local_35b8[(long)cVar51 + 1] = 0x1aa;
                        local_35b0[(long)cVar51 + 1] =
                             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Decode.cpp"
                        ;
                        uVar30 = (ulong)(uVar37 & 0xff0000);
                        uVar57 = (ulong)(byte)(cVar51 + 1) << 8;
                        uVar65 = (ulong)(uVar37 & 0xff);
                        goto LAB_0017ae55;
                      }
                      if (((char)local_375c == '\0') ||
                         (uVar30 = local_36c0,
                         (local_37d0->DecodeSubbandMasks).Arr[local_3780 + -1] == '\0')) {
                        local_3108.Key =
                             (unsigned_long *)
                             ((ulong)((int)local_3740[3] * local_3714 & 0x1fffff) << 0x2a |
                             (ulong)(*(int *)((long)local_3740 + 0x14) * (int)local_35c0 & 0x1fffff)
                             << 0x15 | (ulong)((int)local_3740[2] * local_3718 & 0x1fffff));
                        Grid2 = (grid *)(((ulong)(uint)(local_37d0->BrickDims3).field_0.field_0.Y &
                                         0x1fffff) << 0x15 |
                                        (ulong)(uint)(local_37d0->BrickDims3).field_0.field_0.X &
                                        0x1fffff);
                        local_3108.Val =
                             (brick_volume *)
                             ((ulong)((local_37d0->BrickDims3).field_0.field_0.Z & 0x1fffff) << 0x2a
                             | (ulong)Grid2);
                        local_3108.Ht = local_34f8;
                        Crop<idx2::grid,idx2::grid>
                                  ((grid *)&local_3458,(idx2 *)&local_3410,(grid *)&local_3108,Grid2
                                  );
                        Relative<idx2::grid,idx2::grid>
                                  ((grid *)&local_3628,(idx2 *)&local_3458,(grid *)&local_3108,Grid2
                                  );
                        dVar19 = local_3178[0x20];
                        dVar41 = local_3538;
                        oVar5 = local_37a0->OutMode;
                        if (oVar5 < HashMap) {
                          Relative<idx2::grid,idx2::grid>
                                    ((grid *)&local_33c8,(idx2 *)&local_3458,&local_3410,Grid2);
                          if (oVar5 == RegularGridFile) {
                            dVar41 = dVar19;
                          }
                          Key_01 = &local_3558;
                          if (oVar5 == RegularGridFile) {
                            Key_01 = (byte **)local_3178;
                          }
                          pcVar33 = CopyGridGrid<double,double>;
                          if (dVar41 == float32) {
                            pcVar33 = CopyGridGrid<double,float>;
                          }
                          (*pcVar33)(&local_3628,&local_3498,&local_33c8);
                          Dealloc(&local_3498);
                          Delete<unsigned_long,idx2::brick_volume>
                                    ((iterator *)&local_33c8,(idx2 *)(local_2ec8 + 0x38),
                                     (hash_table<unsigned_long,_idx2::brick_volume> *)local_36a0,
                                     (unsigned_long *)Key_01);
                          uVar30 = local_36c0;
                        }
                        else {
                          uVar30 = local_36c0;
                          if ((oVar5 == HashMap) && ((local_2ee8.Val)->Significant == false)) {
                            Dealloc(&local_3498);
                            Delete<unsigned_long,idx2::brick_volume>
                                      ((iterator *)&local_33c8,(idx2 *)(local_2ec8 + 0x38),
                                       (hash_table<unsigned_long,_idx2::brick_volume> *)local_36a0,
                                       (unsigned_long *)Grid2);
                            uVar30 = local_36c0;
                          }
                        }
                      }
                    }
                  }
                  iVar34 = (int)uVar30;
                  uVar30 = uVar30 & 0xffffffff;
                } while (-1 < iVar34);
                uVar30 = local_35c8 & 0xffffffff;
              }
              else {
                auStack_2c1c._4_4_ = (undefined4)*(undefined8 *)(auStack_1c28 + lVar38 + 0x10);
                uStack_2c14 = (uint)((ulong)*(undefined8 *)(auStack_1c28 + lVar38 + 0x10) >> 0x20);
                lStack_2c10 = alStack_1c10[uVar65 * 8];
                aiStack_2c08[0] = (int)alStack_1c10[uVar65 * 8 + 1];
                aiStack_2c08[1] = (int)((ulong)alStack_1c10[uVar65 * 8 + 1] >> 0x20);
                alStack_2c00[0] = *(long *)(local_1bf8 + uVar65 * 0x40 + -8);
                local_2c38[0] = *puVar64;
                local_2c38[1] = *(ulong *)(auStack_1c28 + lVar38 + -8);
                uStack_2c28._0_4_ = (uint)*(undefined8 *)(auStack_1c28 + lVar38);
                uStack_2c28._4_4_ = (uint)((ulong)*(undefined8 *)(auStack_1c28 + lVar38) >> 0x20);
                uStack_2c20 = (uint)*(undefined8 *)(auStack_1c28 + lVar38 + 8);
                auStack_2c1c._0_4_ =
                     (undefined4)((ulong)*(undefined8 *)(auStack_1c28 + lVar38 + 8) >> 0x20);
                local_33c8.Keys = (unsigned_long *)*puVar64;
                local_33c8.Vals = *(brick_volume **)(auStack_1c28 + lVar38 + -8);
                local_33c8.Stats = *(bucket_status **)(auStack_1c28 + lVar38);
                auVar2 = *(undefined1 (*) [32])(auStack_1c28 + lVar38 + 8);
                local_33c8.LogCapacity._0_4_ = auVar2._8_4_;
                local_33c8.LogCapacity._4_4_ = auVar2._12_4_;
                local_33c8.Alloc = auVar2._16_8_;
                iStack_3398 = auVar2._24_4_;
                uStack_3394 = auVar2._28_4_;
                local_33c8.Size._0_4_ = (uint)*(undefined8 *)(auStack_1c28 + lVar38 + 8);
                local_33c8.Size._4_4_ =
                     (int)((ulong)*(undefined8 *)(auStack_1c28 + lVar38 + 8) >> 0x20);
                uVar57 = (ulong)(uVar37 << 2);
                iVar34 = (*(int *)(auStack_1c28 + uVar57 + lVar38 + 0xc) -
                         *(int *)(auStack_1c28 + uVar57 + lVar38)) / 2 +
                         *(int *)(auStack_1c28 + uVar57 + lVar38);
                *(int *)(auStack_2c1c + uVar57) = iVar34;
                *(int *)((long)&local_33c8.Stats + uVar57) = iVar34;
                lVar47 = lStack_2c10;
                local_37b0 = (ulong)(uint)uStack_2c28;
                local_3798 = (u64)uStack_2c28._4_4_;
                local_37a8 = (brick_volume *)CONCAT44(local_37a8._4_4_,auStack_2c1c._0_4_);
                uVar37 = auStack_2c1c._0_4_ - (uint)uStack_2c28;
                local_37c8 = CONCAT44(local_37c8._4_4_,auStack_2c1c._4_4_);
                uVar43 = auStack_2c1c._4_4_ - uStack_2c28._4_4_;
                local_37bc._4_4_ = uStack_2c14;
                uVar42 = uStack_2c14 - uStack_2c20;
                local_37d4 = uStack_2c20;
                local_3108.Key =
                     (unsigned_long *)
                     ((ulong)(uStack_2c20 & 0x1fffff) << 0x2a |
                     (local_3798 & 0x1fffff) << 0x15 | local_37b0 & 0x1fffff);
                local_3108.Val =
                     (brick_volume *)
                     ((ulong)(uVar42 & 0x1fffff) << 0x2a |
                     (ulong)(uVar43 & 0x1fffff) << 0x15 | (ulong)(uVar37 & 0x1fffff));
                local_3778 = uVar30;
                eVar70 = Crop<idx2::extent,idx2::extent>((extent *)&local_3108,&local_3578);
                iVar34 = aiStack_2c08[0];
                uVar31 = eVar70.Dims;
                local_33c8.Alloc =
                     (allocator *)
                     (((long)(uVar31 << 0x16) >> 0x2b) * ((long)(uVar31 << 0x2b) >> 0x2b) *
                      ((long)(uVar31 * 2) >> 0x2b) + lVar47);
                eVar70 = Crop<idx2::extent,idx2::extent>((extent *)&local_3108,&local_33f8);
                iStack_3398 = (((int)eVar70.Dims << 0xb) >> 0xb) *
                              (int)((long)(eVar70.Dims * 2) >> 0x2b) *
                              (int)((long)(eVar70.Dims << 0x16) >> 0x2b) + iVar34;
                alStack_2c00[0] = *(long *)(local_1bf8 + uVar65 * 0x40 + -8);
                uStack_3390 = (long)(int)uVar42 * (long)(int)uVar43 * (long)(int)uVar37 +
                              alStack_2c00[0];
                iVar35 = (int)((long)(local_3578.From << 0x2b) >> 0x2b);
                iVar36 = (((int)local_3578.Dims << 0xb) >> 0xb) + iVar35;
                iVar34 = (int)((long)(local_3578.From * 2) >> 0x2b);
                iVar53 = (int)((long)(local_3578.Dims * 2) >> 0x2b) + iVar34;
                iVar59 = (int)(((long)(local_3578.Dims << 0x16) >> 0xb) +
                               ((long)(local_3578.From << 0x16) >> 0xb & 0xffffffff00000000U) >>
                              0x20);
                iVar27 = (int)((long)(local_3578.From << 0x16) >> 0x2b);
                uVar30 = local_35c8;
                if (((((int)local_33c8.Stats < iVar36) && ((int)local_33c8.Stats._4_4_ < iVar59)) &&
                    ((int)(uint)local_33c8.Size < iVar53)) &&
                   (((iVar35 < local_33c8.Size._4_4_ && (iVar27 < (int)local_33c8.LogCapacity)) &&
                    (iVar34 < (int)local_33c8.LogCapacity._4_4_)))) {
                  auVar13._4_4_ = local_33c8.LogCapacity._4_4_;
                  auVar13._0_4_ = (int)local_33c8.LogCapacity;
                  auVar13._8_8_ = local_33c8.Alloc;
                  auVar13._16_4_ = iStack_3398;
                  auVar13._20_4_ = uStack_3394;
                  auVar13._24_8_ = uStack_3390;
                  *(undefined1 (*) [32])(auStack_1c28 + lVar38 + 0x10) = auVar13;
                  *puVar64 = (ulong)local_33c8.Keys;
                  *(brick_volume **)(auStack_1c28 + lVar38 + -8) = local_33c8.Vals;
                  *(bucket_status **)(auStack_1c28 + lVar38) = local_33c8.Stats;
                  *(ulong *)(auStack_1c28 + lVar38 + 8) =
                       CONCAT44(local_33c8.Size._4_4_,(uint)local_33c8.Size);
                  uVar30 = local_3778;
                }
                Idx2_00 = local_37d0;
                if ((((int)local_37b0 < iVar36) && ((int)local_3798 < iVar59)) &&
                   (((int)local_37d4 < iVar53 &&
                    ((iVar35 < (int)local_37a8 &&
                     (iVar34 < (int)local_37bc._4_4_ && iVar27 < (int)local_37c8)))))) {
                  uVar30 = (ulong)((int)uVar30 + 1);
                  lVar38 = uVar30 * 0x40;
                  auVar17._4_4_ = uStack_2c14;
                  auVar17._0_4_ = auStack_2c1c._4_4_;
                  auVar17._8_8_ = lStack_2c10;
                  auVar17._16_4_ = aiStack_2c08[0];
                  auVar17._20_4_ = aiStack_2c08[1];
                  auVar17._24_8_ = alStack_2c00[0];
                  *(undefined1 (*) [32])(auStack_1c28 + lVar38 + 0x10) = auVar17;
                  *(ulong *)(local_1c38 + lVar38) = local_2c38[0];
                  *(ulong *)(auStack_1c28 + lVar38 + -8) = local_2c38[1];
                  *(ulong *)(auStack_1c28 + lVar38) = CONCAT44(uStack_2c28._4_4_,(uint)uStack_2c28);
                  *(ulong *)(auStack_1c28 + lVar38 + 8) = CONCAT44(auStack_2c1c._0_4_,uStack_2c20);
                }
              }
            }
            uVar57 = local_3700;
            ppVar50 = local_37a0;
          } while (-1 < (int)uVar30);
        }
        else {
          uVar62 = *(undefined8 *)(aiStack_c28 + uVar65 * 0xc);
          uVar11 = *(undefined8 *)(auStack_c20 + lVar38);
          auVar2 = *(undefined1 (*) [32])(aiStack_c28 + uVar65 * 0xc);
          local_1c38._0_8_ = *puVar64;
          local_1c38._8_8_ = local_c38[uVar65 * 6 + 1];
          stack0xffffffffffffe3e8 = auVar2._16_16_;
          auStack_1c28._8_8_ = uVar11;
          auStack_1c28._0_8_ = uVar62;
          auVar13 = _auStack_1c28;
          auStack_2c1c._4_4_ = (undefined4)*(undefined8 *)(aiStack_c18 + uVar65 * 0xc);
          uStack_2c14 = (uint)((ulong)*(undefined8 *)(aiStack_c18 + uVar65 * 0xc) >> 0x20);
          local_2c38[0] = *puVar64;
          local_2c38[1] = local_c38[uVar65 * 6 + 1];
          uStack_2c28._0_4_ = (uint)*(undefined8 *)(aiStack_c28 + uVar65 * 0xc);
          uStack_2c28._4_4_ = (uint)((ulong)*(undefined8 *)(aiStack_c28 + uVar65 * 0xc) >> 0x20);
          uStack_2c20 = (uint)*(undefined8 *)(auStack_c20 + lVar38);
          auStack_2c1c._0_4_ = (undefined4)((ulong)*(undefined8 *)(auStack_c20 + lVar38) >> 0x20);
          uVar30 = (ulong)(uVar37 << 2);
          iVar34 = *(int *)((long)aiStack_c28 + uVar30 + lVar38);
          iVar34 = (*(int *)(auStack_c20 + uVar30 + lVar38 + 4) - iVar34) / 2 + iVar34;
          *(int *)(auStack_1c28 + uVar30 + 0xc) = iVar34;
          *(int *)((long)&uStack_2c28 + uVar30) = iVar34;
          auStack_1c28._12_4_ = (undefined4)((ulong)uVar11 >> 0x20);
          uVar23 = auStack_1c28._12_4_;
          auStack_1c28._0_4_ = (undefined4)uVar62;
          uVar20 = auStack_1c28._0_4_;
          auStack_1c28._4_4_ = (undefined4)((ulong)uVar62 >> 0x20);
          uVar21 = auStack_1c28._4_4_;
          iVar36 = auStack_1c28._12_4_ - auStack_1c28._0_4_;
          auStack_1c28._16_4_ = auVar2._16_4_;
          uVar24 = auStack_1c28._16_4_;
          iVar27 = auStack_1c28._16_4_ - auStack_1c28._4_4_;
          iStack_1c14 = auVar2._20_4_;
          iVar34 = iStack_1c14;
          auStack_1c28._8_4_ = (undefined4)uVar11;
          uVar22 = auStack_1c28._8_4_;
          iVar35 = iStack_1c14 - auStack_1c28._8_4_;
          _auStack_1c28 = auVar13._0_24_;
          alStack_1c10[0] = alStack_c10[uVar65 * 6];
          lStack_2c10 = (long)iVar35 * (long)iVar27 * (long)iVar36 + alStack_c10[uVar65 * 6];
          if (((((int)(uint)uStack_2c28 < (int)local_35d0) &&
               ((int)uStack_2c28._4_4_ < (int)local_35f8)) &&
              (((int)uStack_2c20 < (int)local_3748 &&
               (((int)local_3600 < (int)auStack_2c1c._0_4_ &&
                ((int)local_3608 < (int)auStack_2c1c._4_4_)))))) &&
             ((int)local_3708 < (int)uStack_2c14)) {
            auVar2._4_4_ = uStack_2c28._4_4_;
            auVar2._0_4_ = (uint)uStack_2c28;
            auVar2._8_4_ = uStack_2c20;
            auVar2._12_4_ = auStack_2c1c._0_4_;
            auVar2._16_4_ = auStack_2c1c._4_4_;
            auVar2._20_4_ = uStack_2c14;
            auVar2._24_8_ = lStack_2c10;
            *(undefined1 (*) [32])(aiStack_c28 + uVar65 * 0xc) = auVar2;
            *puVar64 = local_2c38[0];
            local_c38[uVar65 * 6 + 1] = local_2c38[1];
            *(ulong *)(aiStack_c28 + uVar65 * 0xc) = CONCAT44(uStack_2c28._4_4_,(uint)uStack_2c28);
            *(ulong *)(auStack_c20 + lVar38) = CONCAT44(auStack_2c1c._0_4_,uStack_2c20);
            local_3700 = uVar57;
          }
          uVar30 = local_3700;
          if ((((((int)uVar20 < (int)local_35d0) && ((int)uVar21 < (int)local_35f8)) &&
               ((int)uVar22 < (int)local_3748)) &&
              (((int)local_3600 < (int)uVar23 && ((int)local_3608 < (int)uVar24)))) &&
             ((int)local_3708 < iVar34)) {
            uVar30 = (ulong)((int)local_3700 + 1);
            *(undefined1 (*) [32])(aiStack_c28 + uVar30 * 0xc) = _auStack_1c28;
            local_c38[uVar30 * 6] = local_1c38._0_8_;
            local_c38[uVar30 * 6 + 1] = local_1c38._8_8_;
            *(undefined8 *)(aiStack_c28 + uVar30 * 0xc) = uVar62;
            *(undefined8 *)(auStack_c20 + uVar30 * 0x30) = uVar11;
          }
          uVar57 = uVar30 & 0xffffffff;
          ppVar50 = local_37a0;
        }
      }
    } while (-1 < (int)uVar57);
    local_37d6 = (char)local_375c;
    iVar34 = local_375c + -1;
    uVar30 = local_36d0;
    lVar38 = local_3520;
    if ((char)iVar34 < '\0') goto LAB_0017ac2c;
  } while( true );
}

Assistant:

error<idx2_err_code>
Decode(const idx2_file& Idx2, const params& P, buffer* OutBuf)
{
  timer DecodeTimer;
  StartTimer(&DecodeTimer);
  // TODO: we should add a --effective-mask
  grid OutGrid = GetGrid(Idx2, P.DecodeExtent);
  mmap_volume OutVol;
  volume OutVolMem;
  idx2_CleanUp(if (P.OutMode == params::out_mode::RegularGridFile) { Unmap(&OutVol); });

  if (P.OutMode == params::out_mode::RegularGridFile)
  {
    metadata Met;
    memcpy(Met.Name, Idx2.Name, sizeof(Met.Name));
    memcpy(Met.Field, Idx2.Field, sizeof(Met.Field));
    Met.Dims3 = Dims(OutGrid);
    Met.DType = Idx2.DType;
    //  printf("zfp decode time = %f\n", DecodeTime_);
    cstr OutFile = P.OutFile ? idx2_PrintScratch("%s/%s", P.OutDir, P.OutFile)
                             : idx2_PrintScratch("%s/%s-tolerance-%f.raw", P.OutDir, ToRawFileName(Met), P.DecodeTolerance);
    //    idx2_RAII(mmap_volume, OutVol, (void)OutVol, Unmap(&OutVol));
    MapVolume(OutFile, Met.Dims3, Met.DType, &OutVol, map_mode::Write);
    printf("writing output volume to %s\n", OutFile);
  }
  else if (P.OutMode == params::out_mode::RegularGridMem)
  {
    OutVolMem.Buffer = *OutBuf;
    SetDims(&OutVolMem, Dims(OutGrid));
    OutVolMem.Type = Idx2.DType;
  }

  const int BrickBytes = Prod(Idx2.BrickDimsExt3) * sizeof(f64);
  // TODO: make the free list allocator threadsafe
  //BrickAlloc_ = free_list_allocator(BrickBytes);
  // TODO: move the decode_data into idx2_file itself
  //idx2_RAII(decode_data, D, Init(&D, &BrickAlloc_));
  idx2_RAII(decode_data, D, Init(&D, &Idx2, &Mallocator())); // for now the allocator seems not a bottleneck
  //  D.QualityLevel = Dw->GetQuality();
  f64 Tolerance = Max(Idx2.Tolerance, P.DecodeTolerance);
  //  i64 CountZeroes = 0;

  decode_state Ds;
  idx2_InclusiveForBackward (i8, Level, Idx2.NLevels - 1, 0)
  {
    if (Idx2.DecodeSubbandMasks[Level] == 0)
      break;

    extent Ext = P.DecodeExtent;                  // this is in unit of samples
    v3i B3, Bf3, Bl3, C3, Cf3, Cl3, F3, Ff3, Fl3; // Brick dimensions, brick first, brick last
    B3 = Idx2.BrickDims3 * Pow(Idx2.GroupBrick3, Level);
    C3 = Idx2.BricksPerChunk3s[Level] * B3;
    F3 = C3 * Idx2.ChunksPerFile3s[Level];

    Bf3 = From(Ext) / B3;
    Bl3 = Last(Ext) / B3;
    Cf3 = From(Ext) / C3;
    Cl3 = Last(Ext) / C3;
    Ff3 = From(Ext) / F3;
    Fl3 = Last(Ext) / F3;

    extent ExtentInBricks(Bf3, Bl3 - Bf3 + 1);
    extent ExtentInChunks(Cf3, Cl3 - Cf3 + 1);
    extent ExtentInFiles(Ff3, Fl3 - Ff3 + 1);

    extent VolExt(Idx2.Dims3);
    v3i Vbf3, Vbl3, Vcf3, Vcl3, Vff3, Vfl3; // VolBrickFirst, VolBrickLast
    Vbf3 = From(VolExt) / B3;
    Vbl3 = Last(VolExt) / B3;
    Vcf3 = From(VolExt) / C3;
    Vcl3 = Last(VolExt) / C3;
    Vff3 = From(VolExt) / F3;
    Vfl3 = Last(VolExt) / F3;

    extent VolExtentInBricks(Vbf3, Vbl3 - Vbf3 + 1);
    extent VolExtentInChunks(Vcf3, Vcl3 - Vcf3 + 1);
    extent VolExtentInFiles(Vff3, Vfl3 - Vff3 + 1);

    idx2_FileTraverse(
      //      u64 FileAddr = FileTop.Address;
      //      idx2_Assert(FileAddr == GetLinearFile(Idx2, Level, FileTop.FileFrom3));
      idx2_ChunkTraverse(
        //        u64 ChunkAddr = (FileAddr * Idx2.ChunksPerFiles[Level]) + ChunkTop.Address;
        //        idx2_Assert(ChunkAddr == GetLinearChunk(Idx2, Level, ChunkTop.ChunkFrom3));
        //D.ChunkInFile = ChunkTop.ChunkInFile;
        idx2_BrickTraverse(
          Ds.BrickInChunk = Top.BrickInChunk;
          //          u64 BrickAddr = (ChunkAddr * Idx2.BricksPerChunks[Level]) + Top.Address;
          //          idx2_Assert(BrickAddr == GetLinearBrick(Idx2, Level, Top.BrickFrom3));
          brick_volume BVol;
          Resize(&BVol.Vol, Idx2.BrickDimsExt3, dtype::float64, D.Alloc);
          // TODO: for progressive decompression, copy the data from BrickTable to BrickVol
          Fill(idx2_Range(f64, BVol.Vol), 0.0); // TODO: use memset
          Ds.Level = Level;
          Ds.Brick3 = Top.BrickFrom3;
          Ds.Brick = GetLinearBrick(Idx2, Level, Top.BrickFrom3);
          //printf("level = %d brick = %llu\n", Level, D.Brick[Level]);
          u64 BrickKey = GetBrickKey(Level, Ds.Brick);
          auto BrickIt = Insert(&D.BrickPool.BrickTable, BrickKey, BVol);
          // TODO: pass the brick iterator into the DecodeBrick function to avoid one extra lookup
          /* --------------- Decode the brick --------------- */
          idx2_PropagateIfError(DecodeBrick(Idx2, P, &D, Ds, Tolerance));
          // Copy the samples out to the output buffer (or file)
          // The Idx2.DecodeSubbandMasks[Level - 1] == 0 means that no subbands on the next level
          // will be decoded, so we can now just copy the result out
          /* -------------------- Copy wavelet inverse transform samples to the output --------------- */
          if (Level == 0 || Idx2.DecodeSubbandMasks[Level - 1] == 0)
          {// TODO: the 1 << level is only true for 1 transform pass per level
            grid BrickGrid(Top.BrickFrom3 * B3, Idx2.BrickDims3, v3i(1 << Level));
            grid OutBrickGrid = Crop(OutGrid, BrickGrid);
            grid BrickGridLocal = Relative(OutBrickGrid, BrickGrid);
            if (P.OutMode == params::out_mode::RegularGridFile ||
                P.OutMode == params::out_mode::RegularGridMem)
            {
              auto OutputVol = P.OutMode == params::out_mode::RegularGridFile ? &OutVol.Vol : &OutVolMem;
              auto CopyFunc = OutputVol->Type == dtype::float32 ? (CopyGridGrid<f64, f32>)
                                                                : (CopyGridGrid<f64, f64>);
              CopyFunc(BrickGridLocal, BVol.Vol, Relative(OutBrickGrid, OutGrid), OutputVol);
              Dealloc(&BVol);
              Delete(&D.BrickPool.BrickTable, BrickKey);
            }
            else if (P.OutMode == params::out_mode::HashMap)
            {
              //printf("deleting\n");
              if (!BrickIt.Val->Significant)
              {
                Dealloc(&BVol);
                // TODO: can we delete straight from the iterator?
                Delete(&D.BrickPool.BrickTable, BrickKey);
              }
            }
          },
          64,
          Idx2.BricksOrderInChunk[Level],
          ChunkTop.ChunkFrom3 * Idx2.BricksPerChunk3s[Level],
          Idx2.BricksPerChunk3s[Level],
          ExtentInBricks,
          VolExtentInBricks);
        ,
        64,
        Idx2.ChunksOrderInFile[Level],
        FileTop.FileFrom3 * Idx2.ChunksPerFile3s[Level],
        Idx2.ChunksPerFile3s[Level],
        ExtentInChunks,
        VolExtentInChunks);
      , 64, Idx2.FilesOrder[Level], v3i(0), Idx2.NFiles3[Level], ExtentInFiles, VolExtentInFiles);
  } // end level loop

  if (P.OutMode == params::out_mode::HashMap)
  {
    PrintStatistics(&D.BrickPool);
    ComputeBrickResolution(&D.BrickPool);
    WriteBricks(&D.BrickPool, "bricks");
  }

  printf("total decode time   = %f\n", Seconds(ElapsedTime(&DecodeTimer)));
  printf("io time             = %f\n", Seconds(D.DecodeIOTime_.load()));
  printf("data movement time  = %f\n", Seconds(D.DataMovementTime_.load()));
  printf("exp   bytes read    = %" PRIi64 "\n", D.BytesExps_.load());
  printf("data  bytes read    = %" PRIi64 "\n", D.BytesData_.load());
  printf("total bytes read    = %" PRIi64 "\n", D.BytesExps_.load() + D.BytesData_.load());
  printf("total bytes decoded = %" PRIi64 "\n", D.BytesDecoded_.load() / 8);
  printf("final size of brick hashmap = %" PRIi64 "\n", Size(D.BrickPool.BrickTable));
  printf("number of significant blocks = %" PRIi64 "\n", D.NSignificantBlocks.load());
  printf("number of insignificant subbands = %" PRIi64 "\n", D.NInsignificantSubbands.load());

  return idx2_Error(err_code::NoError);
}